

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [24];
  undefined1 auVar69 [40];
  undefined1 auVar70 [48];
  undefined1 auVar71 [56];
  undefined1 auVar72 [24];
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  double dVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  __m128 _p_2;
  __m128 _alpha128;
  __m256 _p_1;
  __m256 _alpha256;
  __m512 _p;
  __m512 _alpha512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *m;
  __m512 neg;
  __m512 pos;
  __m256 neg_1;
  __m256 pos_1;
  __m128 neg_2;
  __m128 pos_2;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  int local_2a48;
  undefined8 local_2a38;
  undefined8 local_2a30;
  undefined8 local_2a28;
  undefined4 local_2a20;
  long local_2a18;
  undefined4 local_2a10;
  undefined4 local_2a0c;
  undefined4 local_2a08;
  undefined4 local_2a04;
  undefined4 local_2a00;
  undefined8 local_29f8;
  undefined1 (*local_29f0) [64];
  int local_29e8;
  int local_29e4;
  int local_29e0;
  int local_29dc;
  int local_29d8;
  int local_29d4;
  long *local_29c8;
  undefined1 local_29b5;
  int local_29b4;
  undefined8 *local_29a8;
  undefined8 *local_29a0;
  undefined8 *local_2990;
  undefined1 local_2980 [64];
  uint local_290c;
  undefined1 (*local_2908) [64];
  undefined1 local_2900 [64];
  undefined1 (*local_2888) [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined1 local_2780 [64];
  undefined4 local_2710;
  uint local_270c;
  undefined1 (*local_2708) [64];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  undefined1 (*local_26c8) [64];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined4 local_2634;
  float local_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  float local_261c;
  undefined1 (*local_2618) [64];
  float local_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 (*local_25f8) [64];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined4 local_25b0;
  undefined4 uStack_25ac;
  undefined4 uStack_25a8;
  undefined4 uStack_25a4;
  undefined4 local_2594;
  long local_2590;
  undefined4 local_2584;
  long local_2580;
  undefined1 (*local_2578) [64];
  undefined4 local_256c;
  int local_2568;
  int local_2564;
  undefined8 *local_2560;
  undefined4 local_2554;
  long local_2550;
  undefined8 *local_2530;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [64];
  undefined1 local_22c0 [8];
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  ushort local_2242;
  float local_2240 [2];
  float afStack_2238 [2];
  float afStack_2230 [2];
  float afStack_2228 [2];
  float afStack_2220 [2];
  float afStack_2218 [2];
  float afStack_2210 [2];
  float afStack_2208 [2];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [16];
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  float local_2100 [2];
  float afStack_20f8 [2];
  float afStack_20f0 [2];
  float afStack_20e8 [2];
  float afStack_20e0 [2];
  float afStack_20d8 [2];
  float afStack_20d0 [2];
  float afStack_20c8 [2];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  float local_2040 [2];
  float afStack_2038 [2];
  float afStack_2030 [2];
  float afStack_2028 [2];
  float afStack_2020 [2];
  float afStack_2018 [2];
  float afStack_2010 [2];
  float afStack_2008 [2];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1fc0 [2];
  float afStack_1fb8 [2];
  float afStack_1fb0 [2];
  float afStack_1fa8 [2];
  float afStack_1fa0 [2];
  float afStack_1f98 [2];
  float afStack_1f90 [2];
  float afStack_1f88 [2];
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined1 local_1f40 [64];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80 [2];
  float afStack_1c78 [2];
  float afStack_1c70 [2];
  float afStack_1c68 [2];
  float afStack_1c60 [2];
  float afStack_1c58 [2];
  float afStack_1c50 [2];
  float afStack_1c48 [2];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float local_1bc0 [2];
  float afStack_1bb8 [2];
  float afStack_1bb0 [2];
  float afStack_1ba8 [2];
  float afStack_1ba0 [2];
  float afStack_1b98 [2];
  float afStack_1b90 [2];
  float afStack_1b88 [2];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1b00 [2];
  float afStack_1af8 [2];
  float afStack_1af0 [2];
  float afStack_1ae8 [2];
  float afStack_1ae0 [2];
  float afStack_1ad8 [2];
  float afStack_1ad0 [2];
  float afStack_1ac8 [2];
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  float local_1a40 [2];
  float afStack_1a38 [2];
  float afStack_1a30 [2];
  float afStack_1a28 [2];
  float afStack_1a20 [2];
  float afStack_1a18 [2];
  float afStack_1a10 [2];
  float afStack_1a08 [2];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  float local_1980 [2];
  float afStack_1978 [2];
  float afStack_1970 [2];
  float afStack_1968 [2];
  float afStack_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900 [2];
  float afStack_18f8 [2];
  float afStack_18f0 [2];
  float afStack_18e8 [2];
  float afStack_18e0 [2];
  float afStack_18d8 [2];
  float afStack_18d0 [2];
  float afStack_18c8 [2];
  float local_18c0 [2];
  float afStack_18b8 [2];
  float afStack_18b0 [2];
  float afStack_18a8 [2];
  float afStack_18a0 [2];
  float afStack_1898 [2];
  float afStack_1890 [2];
  float afStack_1888 [2];
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float afStack_1860 [2];
  float afStack_1858 [2];
  float afStack_1850 [2];
  float afStack_1848 [2];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  float local_1800 [2];
  float afStack_17f8 [2];
  float afStack_17f0 [2];
  float afStack_17e8 [2];
  float afStack_17e0 [2];
  float afStack_17d8 [2];
  float afStack_17d0 [2];
  float afStack_17c8 [2];
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  ushort local_1742;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  float afStack_16e0 [2];
  float afStack_16d8 [2];
  float afStack_16d0 [2];
  float afStack_16c8 [2];
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640 [2];
  float afStack_1638 [2];
  float afStack_1630 [2];
  float afStack_1628 [2];
  float afStack_1620 [2];
  float afStack_1618 [2];
  float afStack_1610 [2];
  float afStack_1608 [2];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  float afStack_1560 [2];
  float afStack_1558 [2];
  float afStack_1550 [2];
  float afStack_1548 [2];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined4 local_1404;
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [32];
  undefined4 local_1320;
  undefined4 local_131c;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined4 local_130c;
  undefined4 local_1308;
  undefined4 local_1304;
  undefined1 local_1300 [32];
  uint local_12e0;
  uint local_12dc;
  uint local_12d8;
  uint local_12d4;
  uint local_12d0;
  uint local_12cc;
  uint local_12c8;
  uint local_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [8];
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined4 local_1160;
  undefined4 uStack_115c;
  undefined4 uStack_1158;
  undefined4 uStack_1154;
  undefined4 uStack_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [8];
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined1 local_f80 [8];
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined4 local_e40;
  undefined4 uStack_e3c;
  undefined4 uStack_e38;
  undefined4 uStack_e34;
  undefined4 uStack_e30;
  undefined4 uStack_e2c;
  undefined4 uStack_e28;
  undefined4 uStack_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined4 local_de0;
  undefined4 uStack_ddc;
  undefined4 uStack_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined4 local_d80;
  undefined4 uStack_d7c;
  undefined4 uStack_d78;
  undefined4 uStack_d74;
  undefined4 uStack_d70;
  undefined4 uStack_d6c;
  undefined4 uStack_d68;
  undefined4 uStack_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined4 local_d20;
  undefined4 uStack_d1c;
  undefined4 uStack_d18;
  undefined4 uStack_d14;
  undefined4 uStack_d10;
  undefined4 uStack_d0c;
  undefined4 uStack_d08;
  undefined4 uStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined4 local_cc0;
  undefined4 uStack_cbc;
  undefined4 uStack_cb8;
  undefined4 uStack_cb4;
  undefined4 uStack_cb0;
  undefined4 uStack_cac;
  undefined4 uStack_ca8;
  undefined4 uStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c60;
  undefined4 uStack_c5c;
  undefined4 uStack_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  undefined4 uStack_c48;
  undefined4 uStack_c44;
  undefined4 local_c40;
  undefined4 uStack_c3c;
  undefined4 uStack_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 uStack_c28;
  undefined4 uStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_ba0;
  undefined4 uStack_b9c;
  undefined4 uStack_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 uStack_b88;
  undefined4 uStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined4 local_b40;
  undefined4 uStack_b3c;
  undefined4 uStack_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b28;
  undefined4 uStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined4 local_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined4 local_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined4 local_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_29d4 = *(int *)((long)in_RSI + 0x2c);
  local_29d8 = (int)in_RSI[6];
  local_29dc = (int)in_RSI[7];
  local_29e0 = (int)in_RSI[3];
  local_29e4 = local_29d4 * local_29d8 * local_29e0;
  local_29c8 = in_RSI;
  for (local_29e8 = 0; local_29e8 < local_29dc; local_29e8 = local_29e8 + 1) {
    local_29a8 = &local_2a38;
    local_2564 = *(int *)((long)local_29c8 + 0x2c);
    local_2568 = (int)local_29c8[6];
    local_256c = *(undefined4 *)((long)local_29c8 + 0x34);
    local_2578 = (undefined1 (*) [64])
                 (*local_29c8 + local_29c8[8] * (long)local_29e8 * local_29c8[2]);
    local_2580 = local_29c8[2];
    local_2584 = (undefined4)local_29c8[3];
    local_2590 = local_29c8[4];
    local_2560 = &local_2a38;
    local_2550 = (long)local_2564 * (long)local_2568 * local_2580;
    local_29a0 = &local_2a38;
    local_2990 = &local_2a38;
    local_2554 = 0x10;
    local_29b4 = local_29e8;
    local_29b5 = 1;
    local_2a38 = 0;
    local_2a28 = 0;
    local_2a20 = 0;
    local_2a10 = 0;
    local_2a0c = 0;
    local_2a08 = 0;
    local_2a04 = 0;
    local_2a00 = 0;
    local_29f8 = 0;
    local_2a30 = 0;
    local_2a48 = 0;
    local_290c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_2980 = vbroadcastss_avx512f(ZEXT416(local_290c));
    local_29f0 = local_2578;
    for (; local_2a48 + 0xf < local_29e4; local_2a48 = local_2a48 + 0x10) {
      local_2908 = local_29f0;
      local_27c0 = *(undefined8 *)*local_29f0;
      uStack_27b8 = *(undefined8 *)(*local_29f0 + 8);
      uStack_27b0 = *(undefined8 *)(*local_29f0 + 0x10);
      uStack_27a8 = *(undefined8 *)(*local_29f0 + 0x18);
      uStack_27a0 = *(undefined8 *)(*local_29f0 + 0x20);
      uStack_2798 = *(undefined8 *)(*local_29f0 + 0x28);
      uStack_2790 = *(undefined8 *)(*local_29f0 + 0x30);
      uStack_2788 = *(undefined8 *)(*local_29f0 + 0x38);
      local_2888 = local_29f0;
      local_2800 = local_2980._0_8_;
      uStack_27f8 = local_2980._8_8_;
      uStack_27f0 = local_2980._16_8_;
      uStack_27e8 = local_2980._24_8_;
      uStack_27e0 = local_2980._32_8_;
      uStack_27d8 = local_2980._40_8_;
      uStack_27d0 = local_2980._48_8_;
      uStack_27c8 = local_2980._56_8_;
      local_2440 = 0;
      uStack_2438 = 0;
      uStack_2430 = 0;
      uStack_2428 = 0;
      uStack_2420 = 0;
      uStack_2418 = 0;
      uStack_2410 = 0;
      uStack_2408 = 0;
      local_24c0 = 0;
      uStack_24b8 = 0;
      uStack_24b0 = 0;
      uStack_24a8 = 0;
      uStack_24a0 = 0;
      uStack_2498 = 0;
      uStack_2490 = 0;
      uStack_2488 = 0;
      local_2840 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*local_29f0);
      local_2480 = 0;
      uStack_2478 = 0;
      uStack_2470 = 0;
      uStack_2468 = 0;
      uStack_2460 = 0;
      uStack_2458 = 0;
      uStack_2450 = 0;
      uStack_2448 = 0;
      local_23c0 = 0;
      uStack_23b8 = 0;
      uStack_23b0 = 0;
      uStack_23a8 = 0;
      uStack_23a0 = 0;
      uStack_2398 = 0;
      uStack_2390 = 0;
      uStack_2388 = 0;
      auVar73 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*local_29f0);
      local_2880._0_8_ = auVar73._0_8_;
      local_2880._56_8_ = auVar73._56_8_;
      local_2080 = 0;
      uStack_2078 = 0;
      uStack_2070 = 0;
      uStack_2068 = 0;
      uStack_2060 = 0;
      uStack_2058 = 0;
      uStack_2050 = 0;
      uStack_2048 = 0;
      local_2240[0] = 1.0;
      local_2240[1] = 1.0;
      afStack_2238[0] = 1.0;
      afStack_2238[1] = 1.0;
      afStack_2230[0] = 1.0;
      afStack_2230[1] = 1.0;
      afStack_2228[0] = 1.0;
      afStack_2228[1] = 1.0;
      afStack_2220[0] = 1.0;
      afStack_2220[1] = 1.0;
      afStack_2218[0] = 1.0;
      afStack_2218[1] = 1.0;
      afStack_2210[0] = 1.0;
      afStack_2210[1] = 1.0;
      afStack_2208[0] = 1.0;
      afStack_2208[1] = 1.0;
      local_2000 = local_2880._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_1ff8 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_1ff0 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_1fe8 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_1fe0 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_1fd8 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_1fd0 = local_2140._48_8_;
      uStack_1fc8 = local_2880._56_8_;
      local_2040[0] = 88.37626;
      local_2040[1] = 88.37626;
      afStack_2038[0] = 88.37626;
      afStack_2038[1] = 88.37626;
      afStack_2030[0] = 88.37626;
      afStack_2030[1] = 88.37626;
      afStack_2028[0] = 88.37626;
      afStack_2028[1] = 88.37626;
      afStack_2020[0] = 88.37626;
      afStack_2020[1] = 88.37626;
      afStack_2018[0] = 88.37626;
      afStack_2018[1] = 88.37626;
      afStack_2010[0] = 88.37626;
      afStack_2010[1] = 88.37626;
      afStack_2008[0] = 88.37626;
      afStack_2008[1] = 88.37626;
      auVar74._8_4_ = 88.37626;
      auVar74._12_4_ = 88.37626;
      auVar74._0_4_ = 88.37626;
      auVar74._4_4_ = 88.37626;
      auVar74._16_4_ = 88.37626;
      auVar74._20_4_ = 88.37626;
      auVar74._24_4_ = 88.37626;
      auVar74._28_4_ = 88.37626;
      auVar74._32_4_ = 88.37626;
      auVar74._36_4_ = 88.37626;
      auVar74._40_4_ = 88.37626;
      auVar74._44_4_ = 88.37626;
      auVar74._48_4_ = 88.37626;
      auVar74._52_4_ = 88.37626;
      auVar74._56_4_ = 88.37626;
      auVar74._60_4_ = 88.37626;
      auVar74 = vminps_avx512f(auVar73,auVar74);
      local_2140._0_8_ = auVar74._0_8_;
      local_20c0 = local_2140._0_8_;
      local_2140._8_8_ = auVar74._8_8_;
      uStack_20b8 = local_2140._8_8_;
      local_2140._16_8_ = auVar74._16_8_;
      uStack_20b0 = local_2140._16_8_;
      local_2140._24_8_ = auVar74._24_8_;
      uStack_20a8 = local_2140._24_8_;
      local_2140._32_8_ = auVar74._32_8_;
      uStack_20a0 = local_2140._32_8_;
      local_2140._40_8_ = auVar74._40_8_;
      uStack_2098 = local_2140._40_8_;
      local_2140._48_8_ = auVar74._48_8_;
      uStack_2090 = local_2140._48_8_;
      local_2140._56_8_ = auVar74._56_8_;
      uStack_2088 = local_2140._56_8_;
      local_2100[0] = -88.37626;
      local_2100[1] = -88.37626;
      afStack_20f8[0] = -88.37626;
      afStack_20f8[1] = -88.37626;
      afStack_20f0[0] = -88.37626;
      afStack_20f0[1] = -88.37626;
      afStack_20e8[0] = -88.37626;
      afStack_20e8[1] = -88.37626;
      afStack_20e0[0] = -88.37626;
      afStack_20e0[1] = -88.37626;
      afStack_20d8[0] = -88.37626;
      afStack_20d8[1] = -88.37626;
      afStack_20d0[0] = -88.37626;
      afStack_20d0[1] = -88.37626;
      afStack_20c8[0] = -88.37626;
      afStack_20c8[1] = -88.37626;
      auVar73._8_4_ = -88.37626;
      auVar73._12_4_ = -88.37626;
      auVar73._0_4_ = -88.37626;
      auVar73._4_4_ = -88.37626;
      auVar73._16_4_ = -88.37626;
      auVar73._20_4_ = -88.37626;
      auVar73._24_4_ = -88.37626;
      auVar73._28_4_ = -88.37626;
      auVar73._32_4_ = -88.37626;
      auVar73._36_4_ = -88.37626;
      auVar73._40_4_ = -88.37626;
      auVar73._44_4_ = -88.37626;
      auVar73._48_4_ = -88.37626;
      auVar73._52_4_ = -88.37626;
      auVar73._56_4_ = -88.37626;
      auVar73._60_4_ = -88.37626;
      auVar73 = vmaxps_avx512f(auVar74,auVar73);
      local_2140._0_8_ = auVar73._0_8_;
      local_1840 = local_2140._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_1838 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_1830 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_1828 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_1820 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_1818 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_1810 = local_2140._48_8_;
      local_2140._56_8_ = auVar73._56_8_;
      uStack_1808 = local_2140._56_8_;
      local_1880[0] = 1.442695;
      local_1880[1] = 1.442695;
      afStack_1878[0] = 1.442695;
      afStack_1878[1] = 1.442695;
      afStack_1870[0] = 1.442695;
      afStack_1870[1] = 1.442695;
      afStack_1868[0] = 1.442695;
      afStack_1868[1] = 1.442695;
      afStack_1860[0] = 1.442695;
      afStack_1860[1] = 1.442695;
      afStack_1858[0] = 1.442695;
      afStack_1858[1] = 1.442695;
      afStack_1850[0] = 1.442695;
      afStack_1850[1] = 1.442695;
      afStack_1848[0] = 1.442695;
      afStack_1848[1] = 1.442695;
      local_18c0[0] = 0.5;
      local_18c0[1] = 0.5;
      afStack_18b8[0] = 0.5;
      afStack_18b8[1] = 0.5;
      afStack_18b0[0] = 0.5;
      afStack_18b0[1] = 0.5;
      afStack_18a8[0] = 0.5;
      afStack_18a8[1] = 0.5;
      afStack_18a0[0] = 0.5;
      afStack_18a0[1] = 0.5;
      afStack_1898[0] = 0.5;
      afStack_1898[1] = 0.5;
      afStack_1890[0] = 0.5;
      afStack_1890[1] = 0.5;
      afStack_1888[0] = 0.5;
      afStack_1888[1] = 0.5;
      auVar34._8_4_ = 1.442695;
      auVar34._12_4_ = 1.442695;
      auVar34._0_4_ = 1.442695;
      auVar34._4_4_ = 1.442695;
      auVar34._16_4_ = 1.442695;
      auVar34._20_4_ = 1.442695;
      auVar34._24_4_ = 1.442695;
      auVar34._28_4_ = 1.442695;
      auVar34._32_4_ = 1.442695;
      auVar34._36_4_ = 1.442695;
      auVar34._40_4_ = 1.442695;
      auVar34._44_4_ = 1.442695;
      auVar34._48_4_ = 1.442695;
      auVar34._52_4_ = 1.442695;
      auVar34._56_4_ = 1.442695;
      auVar34._60_4_ = 1.442695;
      auVar33._8_4_ = 0.5;
      auVar33._12_4_ = 0.5;
      auVar33._0_4_ = 0.5;
      auVar33._4_4_ = 0.5;
      auVar33._16_4_ = 0.5;
      auVar33._20_4_ = 0.5;
      auVar33._24_4_ = 0.5;
      auVar33._28_4_ = 0.5;
      auVar33._32_4_ = 0.5;
      auVar33._36_4_ = 0.5;
      auVar33._40_4_ = 0.5;
      auVar33._44_4_ = 0.5;
      auVar33._48_4_ = 0.5;
      auVar33._52_4_ = 0.5;
      auVar33._56_4_ = 0.5;
      auVar33._60_4_ = 0.5;
      auVar74 = vfmadd213ps_avx512f(auVar34,auVar73,auVar33);
      auVar75 = vrndscaleps_avx512f(auVar74,1);
      uVar22 = vcmpps_avx512f(auVar74,auVar75,1);
      local_2242 = (ushort)uVar22;
      local_2180._0_8_ = auVar75._0_8_;
      local_17c0 = local_2180._0_8_;
      local_2180._8_8_ = auVar75._8_8_;
      uStack_17b8 = local_2180._8_8_;
      local_2180._16_8_ = auVar75._16_8_;
      uStack_17b0 = local_2180._16_8_;
      local_2180._24_8_ = auVar75._24_8_;
      uStack_17a8 = local_2180._24_8_;
      local_2180._32_8_ = auVar75._32_8_;
      uStack_17a0 = local_2180._32_8_;
      local_2180._40_8_ = auVar75._40_8_;
      uStack_1798 = local_2180._40_8_;
      local_2180._48_8_ = auVar75._48_8_;
      uStack_1790 = local_2180._48_8_;
      local_2180._56_8_ = auVar75._56_8_;
      uStack_1788 = local_2180._56_8_;
      local_1800[0] = 1.0;
      local_1800[1] = 1.0;
      afStack_17f8[0] = 1.0;
      afStack_17f8[1] = 1.0;
      afStack_17f0[0] = 1.0;
      afStack_17f0[1] = 1.0;
      afStack_17e8[0] = 1.0;
      afStack_17e8[1] = 1.0;
      afStack_17e0[0] = 1.0;
      afStack_17e0[1] = 1.0;
      afStack_17d8[0] = 1.0;
      afStack_17d8[1] = 1.0;
      afStack_17d0[0] = 1.0;
      afStack_17d0[1] = 1.0;
      afStack_17c8[0] = 1.0;
      afStack_17c8[1] = 1.0;
      local_16c0 = local_2180._0_8_;
      uStack_16b8 = local_2180._8_8_;
      uStack_16b0 = local_2180._16_8_;
      uStack_16a8 = local_2180._24_8_;
      uStack_16a0 = local_2180._32_8_;
      uStack_1698 = local_2180._40_8_;
      uStack_1690 = local_2180._48_8_;
      uStack_1688 = local_2180._56_8_;
      local_1700[0] = 1.0;
      local_1700[1] = 1.0;
      afStack_16f8[0] = 1.0;
      afStack_16f8[1] = 1.0;
      afStack_16f0[0] = 1.0;
      afStack_16f0[1] = 1.0;
      afStack_16e8[0] = 1.0;
      afStack_16e8[1] = 1.0;
      afStack_16e0[0] = 1.0;
      afStack_16e0[1] = 1.0;
      afStack_16d8[0] = 1.0;
      afStack_16d8[1] = 1.0;
      afStack_16d0[0] = 1.0;
      afStack_16d0[1] = 1.0;
      afStack_16c8[0] = 1.0;
      afStack_16c8[1] = 1.0;
      auVar35._8_4_ = 1.0;
      auVar35._12_4_ = 1.0;
      auVar35._0_4_ = 1.0;
      auVar35._4_4_ = 1.0;
      auVar35._16_4_ = 1.0;
      auVar35._20_4_ = 1.0;
      auVar35._24_4_ = 1.0;
      auVar35._28_4_ = 1.0;
      auVar35._32_4_ = 1.0;
      auVar35._36_4_ = 1.0;
      auVar35._40_4_ = 1.0;
      auVar35._44_4_ = 1.0;
      auVar35._48_4_ = 1.0;
      auVar35._52_4_ = 1.0;
      auVar35._56_4_ = 1.0;
      auVar35._60_4_ = 1.0;
      local_1740._0_4_ = auVar75._0_4_;
      local_1740._4_4_ = auVar75._4_4_;
      uStack_1738._0_4_ = auVar75._8_4_;
      uStack_1738._4_4_ = auVar75._12_4_;
      uStack_1730._0_4_ = auVar75._16_4_;
      uStack_1730._4_4_ = auVar75._20_4_;
      uStack_1728._0_4_ = auVar75._24_4_;
      uStack_1728._4_4_ = auVar75._28_4_;
      uStack_1720._0_4_ = auVar75._32_4_;
      uStack_1720._4_4_ = auVar75._36_4_;
      uStack_1718._0_4_ = auVar75._40_4_;
      uStack_1718._4_4_ = auVar75._44_4_;
      uStack_1710._0_4_ = auVar75._48_4_;
      uStack_1710._4_4_ = auVar75._52_4_;
      uStack_1708._0_4_ = auVar75._56_4_;
      uStack_1708._4_4_ = auVar75._60_4_;
      auVar74 = vsubps_avx512f(auVar75,auVar35);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_2242 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2242 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2242 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2242 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2242 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2242 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2242 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_21c0._4_4_ = (uint)bVar2 * auVar74._4_4_ | (uint)!bVar2 * local_1740._4_4_;
      local_21c0._0_4_ = (uint)bVar1 * auVar74._0_4_ | (uint)!bVar1 * (int)local_1740;
      local_21c0._8_4_ = (uint)bVar3 * auVar74._8_4_ | (uint)!bVar3 * (int)uStack_1738;
      local_21c0._12_4_ = (uint)bVar4 * auVar74._12_4_ | (uint)!bVar4 * uStack_1738._4_4_;
      uStack_21b0._0_4_ = (uint)bVar5 * auVar74._16_4_ | (uint)!bVar5 * (int)uStack_1730;
      uStack_21b0._4_4_ = (uint)bVar6 * auVar74._20_4_ | (uint)!bVar6 * uStack_1730._4_4_;
      auVar68 = _local_21c0;
      uStack_21a8._0_4_ = (uint)bVar7 * auVar74._24_4_ | (uint)!bVar7 * (int)uStack_1728;
      uStack_21a8._4_4_ = (uint)bVar8 * auVar74._28_4_ | (uint)!bVar8 * uStack_1728._4_4_;
      auVar78 = _local_21c0;
      uStack_21a0._0_4_ =
           (uint)(bVar9 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1720;
      uStack_21a0._4_4_ = (uint)bVar10 * auVar74._36_4_ | (uint)!bVar10 * uStack_1720._4_4_;
      auVar69 = _local_21c0;
      uStack_2198._0_4_ = (uint)bVar11 * auVar74._40_4_ | (uint)!bVar11 * (int)uStack_1718;
      uStack_2198._4_4_ = (uint)bVar12 * auVar74._44_4_ | (uint)!bVar12 * uStack_1718._4_4_;
      auVar70 = _local_21c0;
      uStack_2190._0_4_ = (uint)bVar13 * auVar74._48_4_ | (uint)!bVar13 * (int)uStack_1710;
      uStack_2190._4_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * uStack_1710._4_4_;
      auVar71 = _local_21c0;
      uStack_2188._0_4_ = (uint)bVar15 * auVar74._56_4_ | (uint)!bVar15 * (int)uStack_1708;
      uStack_2188._4_4_ =
           (uint)(bVar9 >> 7) * auVar74._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1708._4_4_;
      auVar74 = _local_21c0;
      local_1540 = local_21c0._0_8_;
      uStack_1538 = local_21c0._8_8_;
      uStack_21b0 = auVar68._16_8_;
      uStack_1530 = uStack_21b0;
      uStack_21a8 = auVar78._24_8_;
      uStack_1528 = uStack_21a8;
      uStack_21a0 = auVar69._32_8_;
      uStack_1520 = uStack_21a0;
      uStack_2198 = auVar70._40_8_;
      uStack_1518 = uStack_2198;
      uStack_2190 = auVar71._48_8_;
      uStack_1510 = uStack_2190;
      uStack_2188 = auVar74._56_8_;
      uStack_1508 = uStack_2188;
      local_1580[0] = 0.6933594;
      local_1580[1] = 0.6933594;
      afStack_1578[0] = 0.6933594;
      afStack_1578[1] = 0.6933594;
      afStack_1570[0] = 0.6933594;
      afStack_1570[1] = 0.6933594;
      afStack_1568[0] = 0.6933594;
      afStack_1568[1] = 0.6933594;
      afStack_1560[0] = 0.6933594;
      afStack_1560[1] = 0.6933594;
      afStack_1558[0] = 0.6933594;
      afStack_1558[1] = 0.6933594;
      afStack_1550[0] = 0.6933594;
      afStack_1550[1] = 0.6933594;
      afStack_1548[0] = 0.6933594;
      afStack_1548[1] = 0.6933594;
      local_15c0 = local_2140._0_8_;
      uStack_15b8 = local_2140._8_8_;
      uStack_15b0 = local_2140._16_8_;
      uStack_15a8 = local_2140._24_8_;
      uStack_15a0 = local_2140._32_8_;
      uStack_1598 = local_2140._40_8_;
      uStack_1590 = local_2140._48_8_;
      uStack_1588 = local_2140._56_8_;
      auVar39._16_8_ = uStack_21b0;
      auVar39._0_16_ = local_21c0;
      auVar39._24_8_ = uStack_21a8;
      auVar39._32_8_ = uStack_21a0;
      auVar39._40_8_ = uStack_2198;
      auVar39._48_8_ = uStack_2190;
      auVar39._56_8_ = uStack_2188;
      auVar38._8_4_ = 0.6933594;
      auVar38._12_4_ = 0.6933594;
      auVar38._0_4_ = 0.6933594;
      auVar38._4_4_ = 0.6933594;
      auVar38._16_4_ = 0.6933594;
      auVar38._20_4_ = 0.6933594;
      auVar38._24_4_ = 0.6933594;
      auVar38._28_4_ = 0.6933594;
      auVar38._32_4_ = 0.6933594;
      auVar38._36_4_ = 0.6933594;
      auVar38._40_4_ = 0.6933594;
      auVar38._44_4_ = 0.6933594;
      auVar38._48_4_ = 0.6933594;
      auVar38._52_4_ = 0.6933594;
      auVar38._56_4_ = 0.6933594;
      auVar38._60_4_ = 0.6933594;
      auVar73 = vfnmadd213ps_avx512f(auVar38,auVar39,auVar73);
      local_1600 = local_21c0._0_8_;
      uStack_15f8 = local_21c0._8_8_;
      uStack_15f0 = uStack_21b0;
      uStack_15e8 = uStack_21a8;
      uStack_15e0 = uStack_21a0;
      uStack_15d8 = uStack_2198;
      uStack_15d0 = uStack_2190;
      uStack_15c8 = uStack_2188;
      local_1640[0] = -0.00021219444;
      local_1640[1] = -0.00021219444;
      afStack_1638[0] = -0.00021219444;
      afStack_1638[1] = -0.00021219444;
      afStack_1630[0] = -0.00021219444;
      afStack_1630[1] = -0.00021219444;
      afStack_1628[0] = -0.00021219444;
      afStack_1628[1] = -0.00021219444;
      afStack_1620[0] = -0.00021219444;
      afStack_1620[1] = -0.00021219444;
      afStack_1618[0] = -0.00021219444;
      afStack_1618[1] = -0.00021219444;
      afStack_1610[0] = -0.00021219444;
      afStack_1610[1] = -0.00021219444;
      afStack_1608[0] = -0.00021219444;
      afStack_1608[1] = -0.00021219444;
      local_2140._0_8_ = auVar73._0_8_;
      local_1680 = local_2140._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_1678 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_1670 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_1668 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_1660 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_1658 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_1650 = local_2140._48_8_;
      local_2140._56_8_ = auVar73._56_8_;
      uStack_1648 = local_2140._56_8_;
      auVar37._16_8_ = uStack_21b0;
      auVar37._0_16_ = local_21c0;
      auVar37._24_8_ = uStack_21a8;
      auVar37._32_8_ = uStack_21a0;
      auVar37._40_8_ = uStack_2198;
      auVar37._48_8_ = uStack_2190;
      auVar37._56_8_ = uStack_2188;
      auVar36._8_4_ = -0.00021219444;
      auVar36._12_4_ = -0.00021219444;
      auVar36._0_4_ = -0.00021219444;
      auVar36._4_4_ = -0.00021219444;
      auVar36._16_4_ = -0.00021219444;
      auVar36._20_4_ = -0.00021219444;
      auVar36._24_4_ = -0.00021219444;
      auVar36._28_4_ = -0.00021219444;
      auVar36._32_4_ = -0.00021219444;
      auVar36._36_4_ = -0.00021219444;
      auVar36._40_4_ = -0.00021219444;
      auVar36._44_4_ = -0.00021219444;
      auVar36._48_4_ = -0.00021219444;
      auVar36._52_4_ = -0.00021219444;
      auVar36._56_4_ = -0.00021219444;
      auVar36._60_4_ = -0.00021219444;
      local_2140 = vfnmadd213ps_avx512f(auVar36,auVar37,auVar73);
      local_1e40 = local_2140._0_8_;
      uStack_1e38 = local_2140._8_8_;
      uStack_1e30 = local_2140._16_8_;
      uStack_1e28 = local_2140._24_8_;
      uStack_1e20 = local_2140._32_8_;
      uStack_1e18 = local_2140._40_8_;
      uStack_1e10 = local_2140._48_8_;
      uStack_1e08 = local_2140._56_8_;
      local_2180 = vmulps_avx512f(local_2140,local_2140);
      uStack_22b8._0_4_ = 0.00019875691;
      uStack_22b8._4_4_ = 0.00019875691;
      local_22c0._0_4_ = 0.00019875691;
      local_22c0._4_4_ = 0.00019875691;
      local_1900[0] = 0.00019875691;
      local_1900[1] = 0.00019875691;
      afStack_18f8[0] = 0.00019875691;
      afStack_18f8[1] = 0.00019875691;
      afStack_18f0[0] = 0.00019875691;
      afStack_18f0[1] = 0.00019875691;
      afStack_18e8[0] = 0.00019875691;
      afStack_18e8[1] = 0.00019875691;
      afStack_18e0[0] = 0.00019875691;
      afStack_18e0[1] = 0.00019875691;
      afStack_18d8[0] = 0.00019875691;
      afStack_18d8[1] = 0.00019875691;
      afStack_18d0[0] = 0.00019875691;
      afStack_18d0[1] = 0.00019875691;
      afStack_18c8[0] = 0.00019875691;
      afStack_18c8[1] = 0.00019875691;
      local_1940 = local_2140._0_8_;
      uStack_1938 = local_2140._8_8_;
      uStack_1930 = local_2140._16_8_;
      uStack_1928 = local_2140._24_8_;
      uStack_1920 = local_2140._32_8_;
      uStack_1918 = local_2140._40_8_;
      uStack_1910 = local_2140._48_8_;
      uStack_1908 = local_2140._56_8_;
      local_1980[0] = 0.0013981999;
      local_1980[1] = 0.0013981999;
      afStack_1978[0] = 0.0013981999;
      afStack_1978[1] = 0.0013981999;
      afStack_1970[0] = 0.0013981999;
      afStack_1970[1] = 0.0013981999;
      afStack_1968[0] = 0.0013981999;
      afStack_1968[1] = 0.0013981999;
      afStack_1960[0] = 0.0013981999;
      afStack_1960[1] = 0.0013981999;
      afStack_1958[0] = 0.0013981999;
      afStack_1958[1] = 0.0013981999;
      afStack_1950[0] = 0.0013981999;
      afStack_1950[1] = 0.0013981999;
      afStack_1948[0] = 0.0013981999;
      afStack_1948[1] = 0.0013981999;
      auVar32._16_4_ = 0.00019875691;
      auVar32._20_4_ = 0.00019875691;
      auVar32._0_16_ = _local_22c0;
      auVar32._24_4_ = 0.00019875691;
      auVar32._28_4_ = 0.00019875691;
      auVar32._32_4_ = 0.00019875691;
      auVar32._36_4_ = 0.00019875691;
      auVar32._40_4_ = 0.00019875691;
      auVar32._44_4_ = 0.00019875691;
      auVar32._48_4_ = 0.00019875691;
      auVar32._52_4_ = 0.00019875691;
      auVar32._56_4_ = 0.00019875691;
      auVar32._60_4_ = 0.00019875691;
      auVar31._8_4_ = 0.0013981999;
      auVar31._12_4_ = 0.0013981999;
      auVar31._0_4_ = 0.0013981999;
      auVar31._4_4_ = 0.0013981999;
      auVar31._16_4_ = 0.0013981999;
      auVar31._20_4_ = 0.0013981999;
      auVar31._24_4_ = 0.0013981999;
      auVar31._28_4_ = 0.0013981999;
      auVar31._32_4_ = 0.0013981999;
      auVar31._36_4_ = 0.0013981999;
      auVar31._40_4_ = 0.0013981999;
      auVar31._44_4_ = 0.0013981999;
      auVar31._48_4_ = 0.0013981999;
      auVar31._52_4_ = 0.0013981999;
      auVar31._56_4_ = 0.0013981999;
      auVar31._60_4_ = 0.0013981999;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar32,auVar31);
      local_22c0 = auVar73._0_8_;
      local_19c0 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_19b8 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_19b0 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_19a8 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_19a0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1998 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1990 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1988 = uStack_2288;
      local_1a00 = local_2140._0_8_;
      uStack_19f8 = local_2140._8_8_;
      uStack_19f0 = local_2140._16_8_;
      uStack_19e8 = local_2140._24_8_;
      uStack_19e0 = local_2140._32_8_;
      uStack_19d8 = local_2140._40_8_;
      uStack_19d0 = local_2140._48_8_;
      uStack_19c8 = local_2140._56_8_;
      local_1a40[0] = 0.008333452;
      local_1a40[1] = 0.008333452;
      afStack_1a38[0] = 0.008333452;
      afStack_1a38[1] = 0.008333452;
      afStack_1a30[0] = 0.008333452;
      afStack_1a30[1] = 0.008333452;
      afStack_1a28[0] = 0.008333452;
      afStack_1a28[1] = 0.008333452;
      afStack_1a20[0] = 0.008333452;
      afStack_1a20[1] = 0.008333452;
      afStack_1a18[0] = 0.008333452;
      afStack_1a18[1] = 0.008333452;
      afStack_1a10[0] = 0.008333452;
      afStack_1a10[1] = 0.008333452;
      afStack_1a08[0] = 0.008333452;
      afStack_1a08[1] = 0.008333452;
      auVar30._8_4_ = 0.008333452;
      auVar30._12_4_ = 0.008333452;
      auVar30._0_4_ = 0.008333452;
      auVar30._4_4_ = 0.008333452;
      auVar30._16_4_ = 0.008333452;
      auVar30._20_4_ = 0.008333452;
      auVar30._24_4_ = 0.008333452;
      auVar30._28_4_ = 0.008333452;
      auVar30._32_4_ = 0.008333452;
      auVar30._36_4_ = 0.008333452;
      auVar30._40_4_ = 0.008333452;
      auVar30._44_4_ = 0.008333452;
      auVar30._48_4_ = 0.008333452;
      auVar30._52_4_ = 0.008333452;
      auVar30._56_4_ = 0.008333452;
      auVar30._60_4_ = 0.008333452;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar30);
      local_22c0 = auVar73._0_8_;
      local_1a80 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1a78 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1a70 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1a68 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1a60 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1a58 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1a50 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1a48 = uStack_2288;
      local_1ac0 = local_2140._0_8_;
      uStack_1ab8 = local_2140._8_8_;
      uStack_1ab0 = local_2140._16_8_;
      uStack_1aa8 = local_2140._24_8_;
      uStack_1aa0 = local_2140._32_8_;
      uStack_1a98 = local_2140._40_8_;
      uStack_1a90 = local_2140._48_8_;
      uStack_1a88 = local_2140._56_8_;
      local_1b00[0] = 0.041665796;
      local_1b00[1] = 0.041665796;
      afStack_1af8[0] = 0.041665796;
      afStack_1af8[1] = 0.041665796;
      afStack_1af0[0] = 0.041665796;
      afStack_1af0[1] = 0.041665796;
      afStack_1ae8[0] = 0.041665796;
      afStack_1ae8[1] = 0.041665796;
      afStack_1ae0[0] = 0.041665796;
      afStack_1ae0[1] = 0.041665796;
      afStack_1ad8[0] = 0.041665796;
      afStack_1ad8[1] = 0.041665796;
      afStack_1ad0[0] = 0.041665796;
      afStack_1ad0[1] = 0.041665796;
      afStack_1ac8[0] = 0.041665796;
      afStack_1ac8[1] = 0.041665796;
      auVar29._8_4_ = 0.041665796;
      auVar29._12_4_ = 0.041665796;
      auVar29._0_4_ = 0.041665796;
      auVar29._4_4_ = 0.041665796;
      auVar29._16_4_ = 0.041665796;
      auVar29._20_4_ = 0.041665796;
      auVar29._24_4_ = 0.041665796;
      auVar29._28_4_ = 0.041665796;
      auVar29._32_4_ = 0.041665796;
      auVar29._36_4_ = 0.041665796;
      auVar29._40_4_ = 0.041665796;
      auVar29._44_4_ = 0.041665796;
      auVar29._48_4_ = 0.041665796;
      auVar29._52_4_ = 0.041665796;
      auVar29._56_4_ = 0.041665796;
      auVar29._60_4_ = 0.041665796;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar29);
      local_22c0 = auVar73._0_8_;
      local_1b40 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1b38 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1b30 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1b28 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1b20 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1b18 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1b10 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1b08 = uStack_2288;
      local_1b80 = local_2140._0_8_;
      uStack_1b78 = local_2140._8_8_;
      uStack_1b70 = local_2140._16_8_;
      uStack_1b68 = local_2140._24_8_;
      uStack_1b60 = local_2140._32_8_;
      uStack_1b58 = local_2140._40_8_;
      uStack_1b50 = local_2140._48_8_;
      uStack_1b48 = local_2140._56_8_;
      local_1bc0[0] = 0.16666666;
      local_1bc0[1] = 0.16666666;
      afStack_1bb8[0] = 0.16666666;
      afStack_1bb8[1] = 0.16666666;
      afStack_1bb0[0] = 0.16666666;
      afStack_1bb0[1] = 0.16666666;
      afStack_1ba8[0] = 0.16666666;
      afStack_1ba8[1] = 0.16666666;
      afStack_1ba0[0] = 0.16666666;
      afStack_1ba0[1] = 0.16666666;
      afStack_1b98[0] = 0.16666666;
      afStack_1b98[1] = 0.16666666;
      afStack_1b90[0] = 0.16666666;
      afStack_1b90[1] = 0.16666666;
      afStack_1b88[0] = 0.16666666;
      afStack_1b88[1] = 0.16666666;
      auVar28._8_4_ = 0.16666666;
      auVar28._12_4_ = 0.16666666;
      auVar28._0_4_ = 0.16666666;
      auVar28._4_4_ = 0.16666666;
      auVar28._16_4_ = 0.16666666;
      auVar28._20_4_ = 0.16666666;
      auVar28._24_4_ = 0.16666666;
      auVar28._28_4_ = 0.16666666;
      auVar28._32_4_ = 0.16666666;
      auVar28._36_4_ = 0.16666666;
      auVar28._40_4_ = 0.16666666;
      auVar28._44_4_ = 0.16666666;
      auVar28._48_4_ = 0.16666666;
      auVar28._52_4_ = 0.16666666;
      auVar28._56_4_ = 0.16666666;
      auVar28._60_4_ = 0.16666666;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar28);
      local_22c0 = auVar73._0_8_;
      local_1c00 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1bf8 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1bf0 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1be8 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1be0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1bd8 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1bd0 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1bc8 = uStack_2288;
      local_1c40 = local_2140._0_8_;
      uStack_1c38 = local_2140._8_8_;
      uStack_1c30 = local_2140._16_8_;
      uStack_1c28 = local_2140._24_8_;
      uStack_1c20 = local_2140._32_8_;
      uStack_1c18 = local_2140._40_8_;
      uStack_1c10 = local_2140._48_8_;
      uStack_1c08 = local_2140._56_8_;
      local_1c80[0] = 0.5;
      local_1c80[1] = 0.5;
      afStack_1c78[0] = 0.5;
      afStack_1c78[1] = 0.5;
      afStack_1c70[0] = 0.5;
      afStack_1c70[1] = 0.5;
      afStack_1c68[0] = 0.5;
      afStack_1c68[1] = 0.5;
      afStack_1c60[0] = 0.5;
      afStack_1c60[1] = 0.5;
      afStack_1c58[0] = 0.5;
      afStack_1c58[1] = 0.5;
      afStack_1c50[0] = 0.5;
      afStack_1c50[1] = 0.5;
      afStack_1c48[0] = 0.5;
      afStack_1c48[1] = 0.5;
      auVar76._8_4_ = 0.5;
      auVar76._12_4_ = 0.5;
      auVar76._0_4_ = 0.5;
      auVar76._4_4_ = 0.5;
      auVar76._16_4_ = 0.5;
      auVar76._20_4_ = 0.5;
      auVar76._24_4_ = 0.5;
      auVar76._28_4_ = 0.5;
      auVar76._32_4_ = 0.5;
      auVar76._36_4_ = 0.5;
      auVar76._40_4_ = 0.5;
      auVar76._44_4_ = 0.5;
      auVar76._48_4_ = 0.5;
      auVar76._52_4_ = 0.5;
      auVar76._56_4_ = 0.5;
      auVar76._60_4_ = 0.5;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar76);
      local_22c0 = auVar73._0_8_;
      local_1cc0 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1cb8 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1cb0 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1ca8 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1ca0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1c98 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1c90 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1c88 = uStack_2288;
      local_1d00 = local_2180._0_8_;
      uStack_1cf8 = local_2180._8_8_;
      uStack_1cf0 = local_2180._16_8_;
      uStack_1ce8 = local_2180._24_8_;
      uStack_1ce0 = local_2180._32_8_;
      uStack_1cd8 = local_2180._40_8_;
      uStack_1cd0 = local_2180._48_8_;
      uStack_1cc8 = local_2180._56_8_;
      local_1d40 = local_2140._0_8_;
      uStack_1d38 = local_2140._8_8_;
      uStack_1d30 = local_2140._16_8_;
      uStack_1d28 = local_2140._24_8_;
      uStack_1d20 = local_2140._32_8_;
      uStack_1d18 = local_2140._40_8_;
      uStack_1d10 = local_2140._48_8_;
      uStack_1d08 = local_2140._56_8_;
      auVar73 = vfmadd213ps_avx512f(local_2180,auVar73,local_2140);
      local_22c0 = auVar73._0_8_;
      local_1f80 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1f78 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1f70 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1f68 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1f60 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1f58 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1f50 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1f48 = uStack_2288;
      local_1fc0[0] = 1.0;
      local_1fc0[1] = 1.0;
      afStack_1fb8[0] = 1.0;
      afStack_1fb8[1] = 1.0;
      afStack_1fb0[0] = 1.0;
      afStack_1fb0[1] = 1.0;
      afStack_1fa8[0] = 1.0;
      afStack_1fa8[1] = 1.0;
      afStack_1fa0[0] = 1.0;
      afStack_1fa0[1] = 1.0;
      afStack_1f98[0] = 1.0;
      afStack_1f98[1] = 1.0;
      afStack_1f90[0] = 1.0;
      afStack_1f90[1] = 1.0;
      afStack_1f88[0] = 1.0;
      afStack_1f88[1] = 1.0;
      auVar75._8_4_ = 1.0;
      auVar75._12_4_ = 1.0;
      auVar75._0_4_ = 1.0;
      auVar75._4_4_ = 1.0;
      auVar75._16_4_ = 1.0;
      auVar75._20_4_ = 1.0;
      auVar75._24_4_ = 1.0;
      auVar75._28_4_ = 1.0;
      auVar75._32_4_ = 1.0;
      auVar75._36_4_ = 1.0;
      auVar75._40_4_ = 1.0;
      auVar75._44_4_ = 1.0;
      auVar75._48_4_ = 1.0;
      auVar75._52_4_ = 1.0;
      auVar75._56_4_ = 1.0;
      auVar75._60_4_ = 1.0;
      auVar75 = vaddps_avx512f(auVar73,auVar75);
      local_1500 = local_21c0._0_8_;
      uStack_14f8 = local_21c0._8_8_;
      uStack_14f0 = uStack_21b0;
      uStack_14e8 = uStack_21a8;
      uStack_14e0 = uStack_21a0;
      uStack_14d8 = uStack_2198;
      uStack_14d0 = uStack_2190;
      uStack_14c8 = uStack_2188;
      auVar40._16_8_ = uStack_21b0;
      auVar40._0_16_ = local_21c0;
      auVar40._24_8_ = uStack_21a8;
      auVar40._32_8_ = uStack_21a0;
      auVar40._40_8_ = uStack_2198;
      auVar40._48_8_ = uStack_2190;
      auVar40._56_8_ = uStack_2188;
      auVar73 = vcvttps2dq_avx512f(auVar40);
      local_1380 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar73 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(auVar73);
      auVar76 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_1480 = vmovdqa64_avx512f(auVar73);
      local_14c0 = vmovdqa64_avx512f(auVar76);
      auVar73 = vmovdqa64_avx512f(local_1480);
      auVar76 = vmovdqa64_avx512f(local_14c0);
      auVar73 = vpaddd_avx512f(auVar73,auVar76);
      auVar73 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(auVar73);
      local_1400 = vmovdqa64_avx512f(auVar73);
      local_1404 = 0x17;
      auVar73 = vmovdqa64_avx512f(local_1400);
      auVar73 = vpslld_avx512f(auVar73,ZEXT416(0x17));
      local_2200 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(local_2200);
      local_13c0 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(local_13c0);
      local_2300 = vmovdqa64_avx512f(auVar73);
      local_22c0 = auVar75._0_8_;
      local_1e80 = local_22c0;
      uStack_22b8 = auVar75._8_8_;
      uStack_1e78 = uStack_22b8;
      uStack_22b0 = auVar75._16_8_;
      uStack_1e70 = uStack_22b0;
      uStack_22a8 = auVar75._24_8_;
      uStack_1e68 = uStack_22a8;
      uStack_22a0 = auVar75._32_8_;
      uStack_1e60 = uStack_22a0;
      uStack_2298 = auVar75._40_8_;
      uStack_1e58 = uStack_2298;
      uStack_2290 = auVar75._48_8_;
      uStack_1e50 = uStack_2290;
      uStack_2288 = auVar75._56_8_;
      uStack_1e48 = uStack_2288;
      local_1ec0 = local_2300._0_8_;
      uStack_1eb8 = local_2300._8_8_;
      uStack_1eb0 = local_2300._16_8_;
      uStack_1ea8 = local_2300._24_8_;
      uStack_1ea0 = local_2300._32_8_;
      uStack_1e98 = local_2300._40_8_;
      uStack_1e90 = local_2300._48_8_;
      uStack_1e88 = local_2300._56_8_;
      _local_22c0 = vmulps_avx512f(auVar75,local_2300);
      local_2340 = local_22c0;
      uStack_2338 = uStack_22b8;
      uStack_2330 = uStack_22b0;
      uStack_2328 = uStack_22a8;
      uStack_2320 = uStack_22a0;
      uStack_2318 = uStack_2298;
      uStack_2310 = uStack_2290;
      uStack_2308 = uStack_2288;
      local_2710 = 0x3f800000;
      local_2780 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2380 = local_2780._0_8_;
      uStack_2378 = local_2780._8_8_;
      uStack_2370 = local_2780._16_8_;
      uStack_2368 = local_2780._24_8_;
      uStack_2360 = local_2780._32_8_;
      uStack_2358 = local_2780._40_8_;
      uStack_2350 = local_2780._48_8_;
      uStack_2348 = local_2780._56_8_;
      local_2880 = vsubps_avx512f(_local_22c0,local_2780);
      local_1f00 = local_2840._0_8_;
      uStack_1ef8 = local_2840._8_8_;
      uStack_1ef0 = local_2840._16_8_;
      uStack_1ee8 = local_2840._24_8_;
      uStack_1ee0 = local_2840._32_8_;
      uStack_1ed8 = local_2840._40_8_;
      uStack_1ed0 = local_2840._48_8_;
      uStack_1ec8 = local_2840._56_8_;
      local_1d80 = local_2980._0_8_;
      uStack_1d78 = local_2980._8_8_;
      uStack_1d70 = local_2980._16_8_;
      uStack_1d68 = local_2980._24_8_;
      uStack_1d60 = local_2980._32_8_;
      uStack_1d58 = local_2980._40_8_;
      uStack_1d50 = local_2980._48_8_;
      uStack_1d48 = local_2980._56_8_;
      local_1dc0 = local_2880._0_8_;
      uStack_1db8 = local_2880._8_8_;
      uStack_1db0 = local_2880._16_8_;
      uStack_1da8 = local_2880._24_8_;
      uStack_1da0 = local_2880._32_8_;
      uStack_1d98 = local_2880._40_8_;
      uStack_1d90 = local_2880._48_8_;
      uStack_1d88 = local_2880._56_8_;
      local_1f40 = vmulps_avx512f(local_2980,local_2880);
      local_2900 = vaddps_avx512f(local_2840,local_1f40);
      *(undefined8 *)*local_29f0 = local_2900._0_8_;
      *(undefined8 *)(*local_29f0 + 8) = local_2900._8_8_;
      *(undefined8 *)(*local_29f0 + 0x10) = local_2900._16_8_;
      *(undefined8 *)(*local_29f0 + 0x18) = local_2900._24_8_;
      *(undefined8 *)(*local_29f0 + 0x20) = local_2900._32_8_;
      *(undefined8 *)(*local_29f0 + 0x28) = local_2900._40_8_;
      *(undefined8 *)(*local_29f0 + 0x30) = local_2900._48_8_;
      *(undefined8 *)(*local_29f0 + 0x38) = local_2900._56_8_;
      local_29f0 = local_29f0 + 1;
      local_2500 = local_27c0;
      uStack_24f8 = uStack_27b8;
      uStack_24f0 = uStack_27b0;
      uStack_24e8 = uStack_27a8;
      uStack_24e0 = uStack_27a0;
      uStack_24d8 = uStack_2798;
      uStack_24d0 = uStack_2790;
      uStack_24c8 = uStack_2788;
      local_2400 = local_27c0;
      uStack_23f8 = uStack_27b8;
      uStack_23f0 = uStack_27b0;
      uStack_23e8 = uStack_27a8;
      uStack_23e0 = uStack_27a0;
      uStack_23d8 = uStack_2798;
      uStack_23d0 = uStack_2790;
      uStack_23c8 = uStack_2788;
      _local_21c0 = auVar74;
      local_1e00 = local_1e40;
      uStack_1df8 = uStack_1e38;
      uStack_1df0 = uStack_1e30;
      uStack_1de8 = uStack_1e28;
      uStack_1de0 = uStack_1e20;
      uStack_1dd8 = uStack_1e18;
      uStack_1dd0 = uStack_1e10;
      uStack_1dc8 = uStack_1e08;
      local_1742 = local_2242;
      local_1740 = local_17c0;
      uStack_1738 = uStack_17b8;
      uStack_1730 = uStack_17b0;
      uStack_1728 = uStack_17a8;
      uStack_1720 = uStack_17a0;
      uStack_1718 = uStack_1798;
      uStack_1710 = uStack_1790;
      uStack_1708 = uStack_1788;
    }
    local_270c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar16 = vinsertps_avx(ZEXT416(local_270c),ZEXT416(local_270c),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_270c),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_270c),0x30);
    auVar17 = vinsertps_avx(ZEXT416(local_270c),ZEXT416(local_270c),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_270c),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_270c),0x30);
    auVar78._16_16_ = auVar16;
    auVar78._0_16_ = auVar17;
    local_1300._0_8_ = auVar17._0_8_;
    local_1300._8_8_ = auVar17._8_8_;
    local_1300._16_8_ = auVar16._0_8_;
    local_1300._24_8_ = auVar16._8_8_;
    for (; local_2a48 + 7 < local_29e4; local_2a48 = local_2a48 + 8) {
      local_2708 = local_29f0;
      local_2660 = *(undefined8 *)*local_29f0;
      uStack_2658 = *(undefined8 *)(*local_29f0 + 8);
      uStack_2650 = *(undefined8 *)(*local_29f0 + 0x10);
      uStack_2648 = *(undefined8 *)(*local_29f0 + 0x18);
      local_26c8 = local_29f0;
      local_2680 = local_1300._0_8_;
      uStack_2678 = local_1300._8_8_;
      uStack_2670 = local_1300._16_8_;
      uStack_2668 = local_1300._24_8_;
      local_1260 = 0;
      uStack_1258 = 0;
      uStack_1250 = 0;
      uStack_1248 = 0;
      local_12a0 = 0;
      uStack_1298 = 0;
      uStack_1290 = 0;
      uStack_1288 = 0;
      local_26a0 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_29f0);
      local_1280 = 0;
      uStack_1278 = 0;
      uStack_1270 = 0;
      uStack_1268 = 0;
      local_1220 = 0;
      uStack_1218 = 0;
      uStack_1210 = 0;
      uStack_1208 = 0;
      auVar20 = vminps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_29f0);
      local_26c0._0_8_ = auVar20._0_8_;
      local_26c0._24_8_ = auVar20._24_8_;
      local_1080 = 0;
      uStack_1078 = 0;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_1160 = 0x3f800000;
      uStack_115c = 0x3f800000;
      uStack_1158 = 0x3f800000;
      uStack_1154 = 0x3f800000;
      uStack_1150 = 0x3f800000;
      uStack_114c = 0x3f800000;
      uStack_1148 = 0x3f800000;
      uStack_1144 = 0x3f800000;
      local_1040 = local_26c0._0_8_;
      local_10e0._8_8_ = auVar20._8_8_;
      uStack_1038 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar20._16_8_;
      uStack_1030 = local_10e0._16_8_;
      uStack_1028 = local_26c0._24_8_;
      local_1060 = 0x42b0c0a5;
      uStack_105c = 0x42b0c0a5;
      uStack_1058 = 0x42b0c0a5;
      uStack_1054 = 0x42b0c0a5;
      uStack_1050 = 0x42b0c0a5;
      uStack_104c = 0x42b0c0a5;
      uStack_1048 = 0x42b0c0a5;
      uStack_1044 = 0x42b0c0a5;
      auVar41._8_4_ = 0x42b0c0a5;
      auVar41._0_8_ = 0x42b0c0a542b0c0a5;
      auVar41._12_4_ = 0x42b0c0a5;
      auVar41._16_4_ = 0x42b0c0a5;
      auVar41._20_4_ = 0x42b0c0a5;
      auVar41._24_4_ = 0x42b0c0a5;
      auVar41._28_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar20,auVar41);
      local_10e0._0_8_ = auVar20._0_8_;
      local_10a0 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar20._8_8_;
      uStack_1098 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar20._16_8_;
      uStack_1090 = local_10e0._16_8_;
      local_10e0._24_8_ = auVar20._24_8_;
      uStack_1088 = local_10e0._24_8_;
      local_10c0 = 0xc2b0c0a5;
      uStack_10bc = 0xc2b0c0a5;
      uStack_10b8 = 0xc2b0c0a5;
      uStack_10b4 = 0xc2b0c0a5;
      uStack_10b0 = 0xc2b0c0a5;
      uStack_10ac = 0xc2b0c0a5;
      uStack_10a8 = 0xc2b0c0a5;
      uStack_10a4 = 0xc2b0c0a5;
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar21._16_4_ = 0xc2b0c0a5;
      auVar21._20_4_ = 0xc2b0c0a5;
      auVar21._24_4_ = 0xc2b0c0a5;
      auVar21._28_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar20,auVar21);
      local_10e0._0_8_ = auVar19._0_8_;
      local_c20 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar19._8_8_;
      uStack_c18 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar19._16_8_;
      uStack_c10 = local_10e0._16_8_;
      local_10e0._24_8_ = auVar19._24_8_;
      uStack_c08 = local_10e0._24_8_;
      local_c40 = 0x3fb8aa3b;
      uStack_c3c = 0x3fb8aa3b;
      uStack_c38 = 0x3fb8aa3b;
      uStack_c34 = 0x3fb8aa3b;
      uStack_c30 = 0x3fb8aa3b;
      uStack_c2c = 0x3fb8aa3b;
      uStack_c28 = 0x3fb8aa3b;
      uStack_c24 = 0x3fb8aa3b;
      local_c60 = 0x3f000000;
      uStack_c5c = 0x3f000000;
      uStack_c58 = 0x3f000000;
      uStack_c54 = 0x3f000000;
      uStack_c50 = 0x3f000000;
      uStack_c4c = 0x3f000000;
      uStack_c48 = 0x3f000000;
      uStack_c44 = 0x3f000000;
      local_a00 = local_10e0._0_8_;
      uStack_9f8 = local_10e0._8_8_;
      uStack_9f0 = local_10e0._16_8_;
      uStack_9e8 = local_10e0._24_8_;
      local_a20 = 0x3fb8aa3b3fb8aa3b;
      uStack_a18 = 0x3fb8aa3b3fb8aa3b;
      uStack_a10 = 0x3fb8aa3b3fb8aa3b;
      uStack_a08 = 0x3fb8aa3b3fb8aa3b;
      local_a40 = 0x3f0000003f000000;
      uStack_a38 = 0x3f0000003f000000;
      uStack_a30 = 0x3f0000003f000000;
      uStack_a28 = 0x3f0000003f000000;
      auVar44._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar44._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar44._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar44._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar43._8_8_ = 0x3f0000003f000000;
      auVar43._0_8_ = 0x3f0000003f000000;
      auVar43._16_8_ = 0x3f0000003f000000;
      auVar43._24_8_ = 0x3f0000003f000000;
      auVar23 = vfmadd213ps_fma(auVar44,auVar19,auVar43);
      auVar21 = vroundps_avx(ZEXT1632(auVar23),1);
      auVar20 = vcmpps_avx(ZEXT1632(auVar23),auVar21,1);
      local_1180._0_8_ = auVar20._0_8_;
      local_be0 = local_1180._0_8_;
      local_1180._8_8_ = auVar20._8_8_;
      uStack_bd8 = local_1180._8_8_;
      local_1180._16_8_ = auVar20._16_8_;
      uStack_bd0 = local_1180._16_8_;
      local_1180._24_8_ = auVar20._24_8_;
      uStack_bc8 = local_1180._24_8_;
      local_c00 = 0x3f8000003f800000;
      uStack_bf8 = 0x3f8000003f800000;
      uStack_bf0 = 0x3f8000003f800000;
      uStack_be8 = 0x3f8000003f800000;
      auVar42._8_8_ = 0x3f8000003f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._16_8_ = 0x3f8000003f800000;
      auVar42._24_8_ = 0x3f8000003f800000;
      local_1180 = vpand_avx2(auVar20,auVar42);
      local_1100 = auVar21._0_8_;
      local_1000 = local_1100;
      uStack_10f8 = auVar21._8_8_;
      uStack_ff8 = uStack_10f8;
      uStack_10f0 = auVar21._16_8_;
      uStack_ff0 = uStack_10f0;
      uStack_10e8 = auVar21._24_8_;
      uStack_fe8 = uStack_10e8;
      local_1020 = local_1180._0_8_;
      uStack_1018 = local_1180._8_8_;
      uStack_1010 = local_1180._16_8_;
      uStack_1008 = local_1180._24_8_;
      local_1120 = vsubps_avx(auVar21,local_1180);
      local_b20 = local_1120._0_8_;
      uStack_b18 = local_1120._8_8_;
      uStack_b10 = local_1120._16_8_;
      uStack_b08 = local_1120._24_8_;
      local_b60 = local_10e0._0_8_;
      uStack_b58 = local_10e0._8_8_;
      uStack_b50 = local_10e0._16_8_;
      uStack_b48 = local_10e0._24_8_;
      local_b40 = 0x3f318000;
      uStack_b3c = 0x3f318000;
      uStack_b38 = 0x3f318000;
      uStack_b34 = 0x3f318000;
      uStack_b30 = 0x3f318000;
      uStack_b2c = 0x3f318000;
      uStack_b28 = 0x3f318000;
      uStack_b24 = 0x3f318000;
      local_760 = local_1120._0_8_;
      uStack_758 = local_1120._8_8_;
      uStack_750 = local_1120._16_8_;
      uStack_748 = local_1120._24_8_;
      local_780 = 0x3f3180003f318000;
      uStack_778 = 0x3f3180003f318000;
      uStack_770 = 0x3f3180003f318000;
      uStack_768 = 0x3f3180003f318000;
      local_7a0 = local_10e0._0_8_;
      uStack_798 = local_10e0._8_8_;
      uStack_790 = local_10e0._16_8_;
      uStack_788 = local_10e0._24_8_;
      auVar51._8_8_ = 0x3f3180003f318000;
      auVar51._0_8_ = 0x3f3180003f318000;
      auVar51._16_8_ = 0x3f3180003f318000;
      auVar51._24_8_ = 0x3f3180003f318000;
      auVar23 = vfnmadd213ps_fma(auVar51,local_1120,auVar19);
      local_b80 = local_1120._0_8_;
      uStack_b78 = local_1120._8_8_;
      uStack_b70 = local_1120._16_8_;
      uStack_b68 = local_1120._24_8_;
      local_10e0._0_8_ = auVar23._0_8_;
      local_bc0 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar23._8_8_;
      uStack_bb8 = local_10e0._8_8_;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_ba0 = 0xb95e8083;
      uStack_b9c = 0xb95e8083;
      uStack_b98 = 0xb95e8083;
      uStack_b94 = 0xb95e8083;
      uStack_b90 = 0xb95e8083;
      uStack_b8c = 0xb95e8083;
      uStack_b88 = 0xb95e8083;
      uStack_b84 = 0xb95e8083;
      local_700 = local_1120._0_8_;
      uStack_6f8 = local_1120._8_8_;
      uStack_6f0 = local_1120._16_8_;
      uStack_6e8 = local_1120._24_8_;
      local_720 = 0xb95e8083b95e8083;
      uStack_718 = 0xb95e8083b95e8083;
      uStack_710 = 0xb95e8083b95e8083;
      uStack_708 = 0xb95e8083b95e8083;
      local_740 = local_10e0._0_8_;
      uStack_738 = local_10e0._8_8_;
      uStack_730 = 0;
      uStack_728 = 0;
      auVar52._8_8_ = 0xb95e8083b95e8083;
      auVar52._0_8_ = 0xb95e8083b95e8083;
      auVar52._16_8_ = 0xb95e8083b95e8083;
      auVar52._24_8_ = 0xb95e8083b95e8083;
      auVar24 = vfnmadd213ps_fma(auVar52,local_1120,ZEXT1632(auVar23));
      local_10e0._0_8_ = auVar24._0_8_;
      local_f20 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar24._8_8_;
      uStack_f18 = local_10e0._8_8_;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f00._0_4_ = auVar24._0_4_;
      local_f00._4_4_ = auVar24._4_4_;
      uStack_ef8._0_4_ = auVar24._8_4_;
      uStack_ef8._4_4_ = auVar24._12_4_;
      local_1100._4_4_ = local_f00._4_4_ * local_f00._4_4_;
      local_1100._0_4_ = (float)local_f00 * (float)local_f00;
      local_e80 = local_1100;
      uStack_10f8._0_4_ = (float)uStack_ef8 * (float)uStack_ef8;
      uStack_10f8._4_4_ = uStack_ef8._4_4_ * uStack_ef8._4_4_;
      auVar18 = _local_1100;
      _local_1100 = ZEXT1632(_local_1100);
      auVar41 = _local_1100;
      uStack_1198._0_4_ = 0x39506967;
      local_11a0 = (undefined1  [8])0x3950696739506967;
      uStack_1198._4_4_ = 0x39506967;
      uStack_1190._0_4_ = 0x39506967;
      uStack_1190._4_4_ = 0x39506967;
      auVar68 = _local_11a0;
      uStack_1188._0_4_ = 0x39506967;
      uStack_1188._4_4_ = 0x39506967;
      auVar20 = _local_11a0;
      local_c80 = 0x3950696739506967;
      uStack_c78 = uStack_1198;
      uStack_1190 = auVar68._16_8_;
      uStack_c70 = uStack_1190;
      uStack_1188 = auVar20._24_8_;
      uStack_c68 = uStack_1188;
      local_ca0 = local_10e0._0_8_;
      uStack_c98 = local_10e0._8_8_;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_cc0 = 0x3ab743ce;
      uStack_cbc = 0x3ab743ce;
      uStack_cb8 = 0x3ab743ce;
      uStack_cb4 = 0x3ab743ce;
      uStack_cb0 = 0x3ab743ce;
      uStack_cac = 0x3ab743ce;
      uStack_ca8 = 0x3ab743ce;
      uStack_ca4 = 0x3ab743ce;
      local_9a0 = 0x3950696739506967;
      uStack_998 = uStack_1198;
      uStack_990 = uStack_1190;
      uStack_988 = uStack_1188;
      local_9c0 = local_10e0._0_8_;
      uStack_9b8 = local_10e0._8_8_;
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      local_9e0 = 0x3ab743ce3ab743ce;
      uStack_9d8 = 0x3ab743ce3ab743ce;
      uStack_9d0 = 0x3ab743ce3ab743ce;
      uStack_9c8 = 0x3ab743ce3ab743ce;
      auVar46._16_8_ = uStack_1190;
      auVar46._0_16_ = _local_11a0;
      auVar46._24_8_ = uStack_1188;
      auVar45._8_8_ = 0x3ab743ce3ab743ce;
      auVar45._0_8_ = 0x3ab743ce3ab743ce;
      auVar45._16_8_ = 0x3ab743ce3ab743ce;
      auVar45._24_8_ = 0x3ab743ce3ab743ce;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar46,auVar45);
      local_11a0 = auVar23._0_8_;
      local_ce0 = local_11a0;
      uStack_1198 = auVar23._8_8_;
      uStack_cd8 = uStack_1198;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_10e0._0_8_;
      uStack_cf8 = local_10e0._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20 = 0x3c088908;
      uStack_d1c = 0x3c088908;
      uStack_d18 = 0x3c088908;
      uStack_d14 = 0x3c088908;
      uStack_d10 = 0x3c088908;
      uStack_d0c = 0x3c088908;
      uStack_d08 = 0x3c088908;
      uStack_d04 = 0x3c088908;
      local_940 = local_11a0;
      uStack_938 = uStack_1198;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960 = local_10e0._0_8_;
      uStack_958 = local_10e0._8_8_;
      uStack_950 = 0;
      uStack_948 = 0;
      local_980 = 0x3c0889083c088908;
      uStack_978 = 0x3c0889083c088908;
      uStack_970 = 0x3c0889083c088908;
      uStack_968 = 0x3c0889083c088908;
      auVar47._8_8_ = 0x3c0889083c088908;
      auVar47._0_8_ = 0x3c0889083c088908;
      auVar47._16_8_ = 0x3c0889083c088908;
      auVar47._24_8_ = 0x3c0889083c088908;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar23),auVar47);
      local_11a0 = auVar23._0_8_;
      local_d40 = local_11a0;
      uStack_1198 = auVar23._8_8_;
      uStack_d38 = uStack_1198;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = local_10e0._0_8_;
      uStack_d58 = local_10e0._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d80 = 0x3d2aa9c1;
      uStack_d7c = 0x3d2aa9c1;
      uStack_d78 = 0x3d2aa9c1;
      uStack_d74 = 0x3d2aa9c1;
      uStack_d70 = 0x3d2aa9c1;
      uStack_d6c = 0x3d2aa9c1;
      uStack_d68 = 0x3d2aa9c1;
      uStack_d64 = 0x3d2aa9c1;
      local_8e0 = local_11a0;
      uStack_8d8 = uStack_1198;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900 = local_10e0._0_8_;
      uStack_8f8 = local_10e0._8_8_;
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      local_920 = 0x3d2aa9c13d2aa9c1;
      uStack_918 = 0x3d2aa9c13d2aa9c1;
      uStack_910 = 0x3d2aa9c13d2aa9c1;
      uStack_908 = 0x3d2aa9c13d2aa9c1;
      auVar48._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar48._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar48._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar48._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar23),auVar48);
      local_11a0 = auVar23._0_8_;
      local_da0 = local_11a0;
      uStack_1198 = auVar23._8_8_;
      uStack_d98 = uStack_1198;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = local_10e0._0_8_;
      uStack_db8 = local_10e0._8_8_;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = 0x3e2aaaaa;
      uStack_ddc = 0x3e2aaaaa;
      uStack_dd8 = 0x3e2aaaaa;
      uStack_dd4 = 0x3e2aaaaa;
      uStack_dd0 = 0x3e2aaaaa;
      uStack_dcc = 0x3e2aaaaa;
      uStack_dc8 = 0x3e2aaaaa;
      uStack_dc4 = 0x3e2aaaaa;
      local_880 = local_11a0;
      uStack_878 = uStack_1198;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0 = local_10e0._0_8_;
      uStack_898 = local_10e0._8_8_;
      uStack_890 = 0;
      uStack_888 = 0;
      local_8c0 = 0x3e2aaaaa3e2aaaaa;
      uStack_8b8 = 0x3e2aaaaa3e2aaaaa;
      uStack_8b0 = 0x3e2aaaaa3e2aaaaa;
      uStack_8a8 = 0x3e2aaaaa3e2aaaaa;
      auVar49._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar49._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar49._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar49._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar23),auVar49);
      local_11a0 = auVar23._0_8_;
      local_e00 = local_11a0;
      uStack_1198 = auVar23._8_8_;
      uStack_df8 = uStack_1198;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = local_10e0._0_8_;
      uStack_e18 = local_10e0._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e40 = 0x3f000000;
      uStack_e3c = 0x3f000000;
      uStack_e38 = 0x3f000000;
      uStack_e34 = 0x3f000000;
      uStack_e30 = 0x3f000000;
      uStack_e2c = 0x3f000000;
      uStack_e28 = 0x3f000000;
      uStack_e24 = 0x3f000000;
      local_820 = local_11a0;
      uStack_818 = uStack_1198;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840 = local_10e0._0_8_;
      uStack_838 = local_10e0._8_8_;
      uStack_830 = 0;
      uStack_828 = 0;
      local_860 = 0x3f0000003f000000;
      uStack_858 = 0x3f0000003f000000;
      uStack_850 = 0x3f0000003f000000;
      uStack_848 = 0x3f0000003f000000;
      auVar50._8_8_ = 0x3f0000003f000000;
      auVar50._0_8_ = 0x3f0000003f000000;
      auVar50._16_8_ = 0x3f0000003f000000;
      auVar50._24_8_ = 0x3f0000003f000000;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar23),auVar50);
      local_11a0 = auVar23._0_8_;
      local_e60 = local_11a0;
      uStack_1198 = auVar23._8_8_;
      uStack_e58 = uStack_1198;
      uStack_e50 = 0;
      uStack_e48 = 0;
      uStack_10f8 = auVar18._8_8_;
      uStack_e78 = uStack_10f8;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = local_10e0._0_8_;
      uStack_e98 = local_10e0._8_8_;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_7c0 = local_11a0;
      uStack_7b8 = uStack_1198;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = local_e80;
      uStack_7d8 = uStack_10f8;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      local_800 = local_10e0._0_8_;
      uStack_7f8 = local_10e0._8_8_;
      uStack_7f0 = 0;
      uStack_7e8 = 0;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar23),ZEXT1632(auVar24));
      local_11a0 = auVar23._0_8_;
      uVar22 = local_11a0;
      uStack_1198 = auVar23._8_8_;
      uVar25 = uStack_1198;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      local_fe0 = 0x3f8000003f800000;
      uStack_fd8 = 0x3f8000003f800000;
      uStack_fd0 = 0x3f8000003f800000;
      uStack_fc8 = 0x3f8000003f800000;
      local_fc0._0_4_ = auVar23._0_4_;
      local_fc0._4_4_ = auVar23._4_4_;
      uStack_fb8._0_4_ = auVar23._8_4_;
      uStack_fb8._4_4_ = auVar23._12_4_;
      local_11a0._4_4_ = local_fc0._4_4_ + 1.0;
      local_11a0._0_4_ = (float)local_fc0 + 1.0;
      uStack_1198._0_4_ = (float)uStack_fb8 + 1.0;
      uStack_1198._4_4_ = uStack_fb8._4_4_ + 1.0;
      uStack_1190._0_4_ = 0x3f800000;
      uStack_1190._4_4_ = 0x3f800000;
      auVar68 = _local_11a0;
      uStack_1188._0_4_ = 0x3f800000;
      uStack_1188._4_4_ = 0x3f800000;
      auVar19 = _local_11a0;
      local_b00._0_4_ = local_1120._0_4_;
      local_b00._4_4_ = local_1120._4_4_;
      uStack_af8._0_4_ = local_1120._8_4_;
      uStack_af8._4_4_ = local_1120._12_4_;
      uStack_af0._0_4_ = local_1120._16_4_;
      uStack_af0._4_4_ = local_1120._20_4_;
      uStack_ae8._0_4_ = local_1120._24_4_;
      uStack_ae8._4_4_ = local_1120._28_4_;
      local_1140._4_4_ = (int)local_b00._4_4_;
      local_1140._0_4_ = (int)(float)local_b00;
      local_1140._8_4_ = (int)(float)uStack_af8;
      local_1140._12_4_ = (int)uStack_af8._4_4_;
      local_1140._16_4_ = (int)(float)uStack_af0;
      local_1140._20_4_ = (int)uStack_af0._4_4_;
      auVar72 = local_1140._0_24_;
      local_1140._24_4_ = (int)(float)uStack_ae8;
      local_1140._28_4_ = (int)uStack_ae8._4_4_;
      auVar20 = local_1140;
      local_ac0 = local_1140._0_8_;
      uStack_ab8 = local_1140._8_8_;
      local_1140._16_8_ = auVar72._16_8_;
      uStack_ab0 = local_1140._16_8_;
      local_1140._24_8_ = auVar20._24_8_;
      uStack_aa8 = local_1140._24_8_;
      local_ae0 = 0x7f0000007f;
      uStack_ad8 = 0x7f0000007f;
      uStack_ad0 = 0x7f0000007f;
      uStack_ac8 = 0x7f0000007f;
      local_6c0 = local_1140._0_8_;
      uStack_6b8 = local_1140._8_8_;
      uStack_6b0 = local_1140._16_8_;
      uStack_6a8 = local_1140._24_8_;
      local_6e0 = 0x7f0000007f;
      uStack_6d8 = 0x7f0000007f;
      uStack_6d0 = 0x7f0000007f;
      uStack_6c8 = 0x7f0000007f;
      auVar54._16_8_ = local_1140._16_8_;
      auVar54._0_16_ = local_1140._0_16_;
      auVar54._24_8_ = local_1140._24_8_;
      auVar53._8_8_ = 0x7f0000007f;
      auVar53._0_8_ = 0x7f0000007f;
      auVar53._16_8_ = 0x7f0000007f;
      auVar53._24_8_ = 0x7f0000007f;
      auVar20 = vpaddd_avx2(auVar54,auVar53);
      local_1140._0_8_ = auVar20._0_8_;
      local_a80 = local_1140._0_8_;
      local_1140._8_8_ = auVar20._8_8_;
      uStack_a78 = local_1140._8_8_;
      local_1140._16_8_ = auVar20._16_8_;
      uStack_a70 = local_1140._16_8_;
      local_1140._24_8_ = auVar20._24_8_;
      uStack_a68 = local_1140._24_8_;
      local_a84 = 0x17;
      local_680 = local_1140._0_8_;
      uStack_678 = local_1140._8_8_;
      uStack_670 = local_1140._16_8_;
      uStack_668 = local_1140._24_8_;
      local_684 = 0x17;
      local_1140 = vpslld_avx2(auVar20,ZEXT416(0x17));
      local_a60 = local_1140._0_8_;
      uStack_a58 = local_1140._8_8_;
      uStack_a50 = local_1140._16_8_;
      uStack_a48 = local_1140._24_8_;
      local_11c0 = local_1140._0_8_;
      uStack_11b8 = local_1140._8_8_;
      uStack_11b0 = local_1140._16_8_;
      uStack_11a8 = local_1140._24_8_;
      local_f40 = local_11a0;
      uStack_f38 = uStack_1198;
      uStack_1190 = auVar68._16_8_;
      uStack_f30 = uStack_1190;
      uStack_1188 = auVar19._24_8_;
      uStack_f28 = uStack_1188;
      local_f60._0_4_ = local_1140._0_4_;
      local_f60._4_4_ = local_1140._4_4_;
      uStack_f58._0_4_ = local_1140._8_4_;
      uStack_f58._4_4_ = local_1140._12_4_;
      uStack_f50._0_4_ = local_1140._16_4_;
      uStack_f50._4_4_ = local_1140._20_4_;
      uStack_f48._0_4_ = local_1140._24_4_;
      local_11a0._4_4_ = (local_fc0._4_4_ + 1.0) * local_f60._4_4_;
      local_11a0._0_4_ = ((float)local_fc0 + 1.0) * (float)local_f60;
      uStack_1198._0_4_ = ((float)uStack_fb8 + 1.0) * (float)uStack_f58;
      uStack_1198._4_4_ = (uStack_fb8._4_4_ + 1.0) * uStack_f58._4_4_;
      uStack_1190._0_4_ = (float)uStack_f50 * 1.0;
      uStack_1190._4_4_ = uStack_f50._4_4_ * 1.0;
      auVar68 = _local_11a0;
      uStack_1188._0_4_ = (float)uStack_f48 * 1.0;
      uStack_1188._4_4_ = 0x3f800000;
      auVar21 = _local_11a0;
      local_11e0 = local_11a0;
      uStack_11d8 = uStack_1198;
      uStack_1190 = auVar68._16_8_;
      uStack_11d0 = uStack_1190;
      uStack_1188 = auVar21._24_8_;
      uStack_11c8 = uStack_1188;
      local_2634 = 0x3f800000;
      local_1320 = 0x3f800000;
      auVar23 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      auVar79._16_16_ = auVar23;
      auVar79._0_16_ = auVar18;
      local_1340._0_8_ = auVar18._0_8_;
      local_1200 = local_1340._0_8_;
      local_1340._8_8_ = auVar18._8_8_;
      uStack_11f8 = local_1340._8_8_;
      local_1340._16_8_ = auVar23._0_8_;
      uStack_11f0 = local_1340._16_8_;
      local_1340._24_8_ = auVar23._8_8_;
      uStack_11e8 = local_1340._24_8_;
      auVar19._16_8_ = uStack_1190;
      auVar19._0_16_ = _local_11a0;
      auVar19._24_8_ = uStack_1188;
      auVar20._16_8_ = local_1340._16_8_;
      auVar20._0_16_ = auVar18;
      auVar20._24_8_ = local_1340._24_8_;
      local_26c0 = vsubps_avx(auVar19,auVar20);
      local_ec0._0_4_ = auVar17._0_4_;
      local_ec0._4_4_ = auVar17._4_4_;
      uStack_eb8._0_4_ = auVar17._8_4_;
      uStack_eb8._4_4_ = auVar17._12_4_;
      uStack_eb0._0_4_ = auVar16._0_4_;
      uStack_eb0._4_4_ = auVar16._4_4_;
      uStack_ea8._0_4_ = auVar16._8_4_;
      uStack_ea8._4_4_ = auVar16._12_4_;
      fStack_f84 = uStack_ea8._4_4_;
      local_ee0._0_4_ = local_26c0._0_4_;
      local_ee0._4_4_ = local_26c0._4_4_;
      uStack_ed8._0_4_ = local_26c0._8_4_;
      uStack_ed8._4_4_ = local_26c0._12_4_;
      uStack_ed0._0_4_ = local_26c0._16_4_;
      uStack_ed0._4_4_ = local_26c0._20_4_;
      uStack_ec8._0_4_ = local_26c0._24_4_;
      local_fa0 = (float)local_ec0 * (float)local_ee0;
      fStack_f9c = local_ec0._4_4_ * local_ee0._4_4_;
      fStack_f98 = (float)uStack_eb8 * (float)uStack_ed8;
      fStack_f94 = uStack_eb8._4_4_ * uStack_ed8._4_4_;
      fStack_f90 = (float)uStack_eb0 * (float)uStack_ed0;
      fStack_f8c = uStack_eb0._4_4_ * uStack_ed0._4_4_;
      fStack_f88 = (float)uStack_ea8 * (float)uStack_ec8;
      local_f80._0_4_ = local_26a0._0_4_;
      local_f80._4_4_ = local_26a0._4_4_;
      fStack_f78 = local_26a0._8_4_;
      fStack_f74 = local_26a0._12_4_;
      fStack_f70 = local_26a0._16_4_;
      fStack_f6c = local_26a0._20_4_;
      fStack_f68 = local_26a0._24_4_;
      fStack_f64 = local_26a0._28_4_;
      local_2700 = (float)local_f80._0_4_ + local_fa0;
      fStack_26fc = (float)local_f80._4_4_ + fStack_f9c;
      fStack_26f8 = fStack_f78 + fStack_f98;
      fStack_26f4 = fStack_f74 + fStack_f94;
      fStack_26f0 = fStack_f70 + fStack_f90;
      fStack_26ec = fStack_f6c + fStack_f8c;
      fStack_26e8 = fStack_f68 + fStack_f88;
      fStack_26e4 = fStack_f64 + uStack_ea8._4_4_;
      *(ulong *)*local_29f0 = CONCAT44(fStack_26fc,local_2700);
      *(ulong *)(*local_29f0 + 8) = CONCAT44(fStack_26f4,fStack_26f8);
      *(ulong *)(*local_29f0 + 0x10) = CONCAT44(fStack_26ec,fStack_26f0);
      *(ulong *)(*local_29f0 + 0x18) = CONCAT44(fStack_26e4,fStack_26e8);
      local_29f0 = (undefined1 (*) [64])(*local_29f0 + 0x20);
      local_1340 = auVar79;
      local_131c = local_1320;
      local_1318 = local_1320;
      local_1314 = local_1320;
      local_1310 = local_1320;
      local_130c = local_1320;
      local_1308 = local_1320;
      local_1304 = local_1320;
      local_12c0 = local_2660;
      uStack_12b8 = uStack_2658;
      uStack_12b0 = uStack_2650;
      uStack_12a8 = uStack_2648;
      local_1240 = local_2660;
      uStack_1238 = uStack_2658;
      uStack_1230 = uStack_2650;
      uStack_1228 = uStack_2648;
      _local_11a0 = auVar21;
      _local_1100 = auVar41;
      local_10e0 = ZEXT1632(auVar24);
      local_fc0 = uVar22;
      uStack_fb8 = uVar25;
      _local_f80 = local_26a0;
      local_f60 = local_1140._0_8_;
      uStack_f58 = local_1140._8_8_;
      uStack_f50 = local_1140._16_8_;
      uStack_f48 = local_1140._24_8_;
      local_f00 = local_f20;
      uStack_ef8 = uStack_f18;
      uStack_ef0 = uStack_f10;
      uStack_ee8 = uStack_f08;
      local_ee0 = local_26c0._0_8_;
      uStack_ed8 = local_26c0._8_8_;
      uStack_ed0 = local_26c0._16_8_;
      uStack_ec8 = local_26c0._24_8_;
      local_ec0 = local_1300._0_8_;
      uStack_eb8 = local_1300._8_8_;
      uStack_eb0 = local_1300._16_8_;
      uStack_ea8 = local_1300._24_8_;
      local_b00 = local_1120._0_8_;
      uStack_af8 = local_1120._8_8_;
      uStack_af0 = local_1120._16_8_;
      uStack_ae8 = local_1120._24_8_;
    }
    local_2630 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    for (; fStack_262c = local_2630, fStack_2628 = local_2630, fStack_2624 = local_2630,
        local_261c = local_2630, local_2530 = local_2990, local_1300 = auVar78,
        local_12e0 = local_270c, local_12dc = local_270c, local_12d8 = local_270c,
        local_12d4 = local_270c, local_12d0 = local_270c, local_12cc = local_270c,
        local_12c8 = local_270c, local_12c4 = local_270c, local_2a18 = local_2590,
        local_2a48 + 3 < local_29e4; local_2a48 = local_2a48 + 4) {
      local_2618 = local_29f0;
      local_25c0 = *(undefined8 *)*local_29f0;
      uStack_25b8 = *(undefined8 *)(*local_29f0 + 8);
      local_25f8 = local_29f0;
      local_630 = (undefined1  [16])0x0;
      local_650 = 0;
      uStack_648 = 0;
      local_25e0 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_29f0);
      local_640 = (undefined1  [16])0x0;
      local_610 = 0;
      uStack_608 = 0;
      auVar16 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_29f0);
      local_25f0._0_8_ = auVar16._0_8_;
      local_25f0._8_8_ = auVar16._8_8_;
      local_540 = (undefined1  [16])0x0;
      local_5b0 = 0x3f800000;
      uStack_5ac = 0x3f800000;
      uStack_5a8 = 0x3f800000;
      uStack_5a4 = 0x3f800000;
      local_520 = local_25f0._0_8_;
      uStack_518 = local_25f0._8_8_;
      local_530 = 0x42b0c0a5;
      uStack_52c = 0x42b0c0a5;
      uStack_528 = 0x42b0c0a5;
      uStack_524 = 0x42b0c0a5;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar18);
      local_570._0_8_ = auVar16._0_8_;
      local_550 = local_570._0_8_;
      local_570._8_8_ = auVar16._8_8_;
      uStack_548 = local_570._8_8_;
      local_560 = 0xc2b0c0a5;
      uStack_55c = 0xc2b0c0a5;
      uStack_558 = 0xc2b0c0a5;
      uStack_554 = 0xc2b0c0a5;
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar23 = vmaxps_avx(auVar16,auVar23);
      local_570._0_8_ = auVar23._0_8_;
      uVar22 = local_570._0_8_;
      local_570._8_8_ = auVar23._8_8_;
      uVar25 = local_570._8_8_;
      local_450 = 0x3fb8aa3b;
      uStack_44c = 0x3fb8aa3b;
      uStack_448 = 0x3fb8aa3b;
      uStack_444 = 0x3fb8aa3b;
      local_440._0_4_ = auVar23._0_4_;
      local_440._4_4_ = auVar23._4_4_;
      uStack_438._0_4_ = auVar23._8_4_;
      uStack_438._4_4_ = auVar23._12_4_;
      local_590._4_4_ = local_440._4_4_ * 1.442695;
      local_590._0_4_ = (float)local_440 * 1.442695;
      uStack_588._0_4_ = (float)uStack_438 * 1.442695;
      uStack_588._4_4_ = uStack_438._4_4_ * 1.442695;
      local_4c0 = local_590;
      uStack_4b8 = uStack_588;
      local_4d0 = 0x3f000000;
      uStack_4cc = 0x3f000000;
      uStack_4c8 = 0x3f000000;
      uStack_4c4 = 0x3f000000;
      local_590._0_4_ = (float)local_440 * 1.442695 + 0.5;
      local_590._4_4_ = local_440._4_4_ * 1.442695 + 0.5;
      fVar80 = (float)uStack_438 * 1.442695 + 0.5;
      fVar81 = uStack_438._4_4_ * 1.442695 + 0.5;
      uStack_588._0_4_ = fVar80;
      uStack_588._4_4_ = fVar81;
      local_400 = local_590;
      uStack_3f8 = uStack_588;
      local_5a0._4_4_ = (int)(float)local_590._4_4_;
      local_5a0._0_4_ = (int)(float)local_590._0_4_;
      local_5a0._8_4_ = (int)fVar80;
      local_5a0._12_4_ = (int)fVar81;
      local_3f0 = local_5a0._0_8_;
      uStack_3e8 = local_5a0._8_8_;
      auVar24._8_8_ = local_5a0._8_8_;
      auVar24._0_8_ = local_5a0._0_8_;
      auVar17 = vcvtdq2ps_avx(auVar24);
      local_580 = auVar17._0_8_;
      local_3d0 = local_580;
      uStack_578 = auVar17._8_8_;
      uStack_3c8 = uStack_578;
      local_3e0 = local_590;
      uStack_3d8 = uStack_588;
      auVar55._8_8_ = uStack_588;
      auVar55._0_8_ = local_590;
      auVar16 = vcmpps_avx(auVar55,auVar17,1);
      local_5c0._0_8_ = auVar16._0_8_;
      local_3b0 = local_5c0._0_8_;
      local_5c0._8_8_ = auVar16._8_8_;
      uStack_3a8 = local_5c0._8_8_;
      local_3c0 = 0x3f8000003f800000;
      uStack_3b8 = 0x3f8000003f800000;
      auVar56._8_8_ = 0x3f8000003f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      local_5c0 = vpand_avx(auVar16,auVar56);
      local_500 = local_580;
      uStack_4f8 = uStack_578;
      local_510 = local_5c0._0_8_;
      uStack_508 = local_5c0._8_8_;
      _local_590 = vsubps_avx(auVar17,local_5c0);
      local_350 = local_590;
      uStack_348 = uStack_588;
      local_370 = local_570._0_8_;
      uStack_368 = local_570._8_8_;
      local_360 = 0x3f318000;
      uStack_35c = 0x3f318000;
      uStack_358 = 0x3f318000;
      uStack_354 = 0x3f318000;
      local_1b0 = local_590;
      uStack_1a8 = uStack_588;
      local_1c0 = 0x3f3180003f318000;
      uStack_1b8 = 0x3f3180003f318000;
      local_1d0 = local_570._0_8_;
      uStack_1c8 = local_570._8_8_;
      auVar59._8_8_ = 0x3f3180003f318000;
      auVar59._0_8_ = 0x3f3180003f318000;
      auVar16 = vfnmadd213ps_fma(auVar59,_local_590,auVar23);
      local_380 = local_590;
      uStack_378 = uStack_588;
      local_570._0_8_ = auVar16._0_8_;
      local_3a0 = local_570._0_8_;
      local_570._8_8_ = auVar16._8_8_;
      uStack_398 = local_570._8_8_;
      local_390 = 0xb95e8083;
      uStack_38c = 0xb95e8083;
      uStack_388 = 0xb95e8083;
      uStack_384 = 0xb95e8083;
      local_180 = local_590;
      uStack_178 = uStack_588;
      local_190 = 0xb95e8083b95e8083;
      uStack_188 = 0xb95e8083b95e8083;
      local_1a0 = local_570._0_8_;
      uStack_198 = local_570._8_8_;
      auVar60._8_8_ = 0xb95e8083b95e8083;
      auVar60._0_8_ = 0xb95e8083b95e8083;
      local_570 = vfnmadd213ps_fma(auVar60,_local_590,auVar16);
      local_470 = local_570._0_8_;
      uStack_468 = local_570._8_8_;
      local_460._0_4_ = local_570._0_4_;
      local_460._4_4_ = local_570._4_4_;
      uStack_458._0_4_ = local_570._8_4_;
      uStack_458._4_4_ = local_570._12_4_;
      local_580 = CONCAT44(local_460._4_4_ * local_460._4_4_,(float)local_460 * (float)local_460);
      uStack_578._0_4_ = (float)uStack_458 * (float)uStack_458;
      uStack_578._4_4_ = uStack_458._4_4_ * uStack_458._4_4_;
      uStack_5c8._0_4_ = 0x39506967;
      local_5d0 = 0x3950696739506967;
      uStack_5c8._4_4_ = 0x39506967;
      local_230 = 0x3950696739506967;
      uStack_228 = uStack_5c8;
      local_240 = local_570._0_8_;
      uStack_238 = local_570._8_8_;
      local_250 = 0x3ab743ce;
      uStack_24c = 0x3ab743ce;
      uStack_248 = 0x3ab743ce;
      uStack_244 = 0x3ab743ce;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_5c8;
      local_160 = local_570._0_8_;
      uStack_158 = local_570._8_8_;
      local_170 = 0x3ab743ce3ab743ce;
      uStack_168 = 0x3ab743ce3ab743ce;
      auVar62._8_8_ = uStack_5c8;
      auVar62._0_8_ = 0x3950696739506967;
      auVar61._8_8_ = 0x3ab743ce3ab743ce;
      auVar61._0_8_ = 0x3ab743ce3ab743ce;
      auVar16 = vfmadd213ps_fma(local_570,auVar62,auVar61);
      local_5d0 = auVar16._0_8_;
      local_260 = local_5d0;
      uStack_5c8 = auVar16._8_8_;
      uStack_258 = uStack_5c8;
      local_270 = local_570._0_8_;
      uStack_268 = local_570._8_8_;
      local_280 = 0x3c088908;
      uStack_27c = 0x3c088908;
      uStack_278 = 0x3c088908;
      uStack_274 = 0x3c088908;
      local_120 = local_5d0;
      uStack_118 = uStack_5c8;
      local_130 = local_570._0_8_;
      uStack_128 = local_570._8_8_;
      local_140 = 0x3c0889083c088908;
      uStack_138 = 0x3c0889083c088908;
      auVar63._8_8_ = 0x3c0889083c088908;
      auVar63._0_8_ = 0x3c0889083c088908;
      auVar16 = vfmadd213ps_fma(local_570,auVar16,auVar63);
      local_5d0 = auVar16._0_8_;
      local_290 = local_5d0;
      uStack_5c8 = auVar16._8_8_;
      uStack_288 = uStack_5c8;
      local_2a0 = local_570._0_8_;
      uStack_298 = local_570._8_8_;
      local_2b0 = 0x3d2aa9c1;
      uStack_2ac = 0x3d2aa9c1;
      uStack_2a8 = 0x3d2aa9c1;
      uStack_2a4 = 0x3d2aa9c1;
      local_f0 = local_5d0;
      uStack_e8 = uStack_5c8;
      local_100 = local_570._0_8_;
      uStack_f8 = local_570._8_8_;
      local_110 = 0x3d2aa9c13d2aa9c1;
      uStack_108 = 0x3d2aa9c13d2aa9c1;
      auVar64._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar64._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar16 = vfmadd213ps_fma(local_570,auVar16,auVar64);
      local_5d0 = auVar16._0_8_;
      local_2c0 = local_5d0;
      uStack_5c8 = auVar16._8_8_;
      uStack_2b8 = uStack_5c8;
      local_2d0 = local_570._0_8_;
      uStack_2c8 = local_570._8_8_;
      local_2e0 = 0x3e2aaaaa;
      uStack_2dc = 0x3e2aaaaa;
      uStack_2d8 = 0x3e2aaaaa;
      uStack_2d4 = 0x3e2aaaaa;
      local_c0 = local_5d0;
      uStack_b8 = uStack_5c8;
      local_d0 = local_570._0_8_;
      uStack_c8 = local_570._8_8_;
      local_e0 = 0x3e2aaaaa3e2aaaaa;
      uStack_d8 = 0x3e2aaaaa3e2aaaaa;
      auVar65._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar16 = vfmadd213ps_fma(local_570,auVar16,auVar65);
      local_5d0 = auVar16._0_8_;
      local_2f0 = local_5d0;
      uStack_5c8 = auVar16._8_8_;
      uStack_2e8 = uStack_5c8;
      local_300 = local_570._0_8_;
      uStack_2f8 = local_570._8_8_;
      local_310 = 0x3f000000;
      uStack_30c = 0x3f000000;
      uStack_308 = 0x3f000000;
      uStack_304 = 0x3f000000;
      local_90 = local_5d0;
      uStack_88 = uStack_5c8;
      local_a0 = local_570._0_8_;
      uStack_98 = local_570._8_8_;
      local_b0 = 0x3f0000003f000000;
      uStack_a8 = 0x3f0000003f000000;
      auVar66._8_8_ = 0x3f0000003f000000;
      auVar66._0_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(local_570,auVar16,auVar66);
      local_5d0 = auVar16._0_8_;
      local_320 = local_5d0;
      uStack_5c8 = auVar16._8_8_;
      uStack_318 = uStack_5c8;
      local_330 = local_580;
      uStack_328 = uStack_578;
      local_340 = local_570._0_8_;
      uStack_338 = local_570._8_8_;
      local_60 = local_5d0;
      uStack_58 = uStack_5c8;
      local_70 = local_580;
      uStack_68 = uStack_578;
      local_80 = local_570._0_8_;
      uStack_78 = local_570._8_8_;
      auVar67._8_8_ = uStack_578;
      auVar67._0_8_ = local_580;
      auVar16 = vfmadd213ps_fma(auVar67,auVar16,local_570);
      local_5d0 = auVar16._0_8_;
      uVar26 = local_5d0;
      uStack_5c8 = auVar16._8_8_;
      uVar27 = uStack_5c8;
      local_4f0 = 0x3f8000003f800000;
      uStack_4e8 = 0x3f8000003f800000;
      local_4e0._0_4_ = auVar16._0_4_;
      local_4e0._4_4_ = auVar16._4_4_;
      uStack_4d8._0_4_ = auVar16._8_4_;
      uStack_4d8._4_4_ = auVar16._12_4_;
      local_5d0 = CONCAT44(local_4e0._4_4_ + 1.0,(float)local_4e0 + 1.0);
      uStack_5c8._0_4_ = (float)uStack_4d8 + 1.0;
      uStack_5c8._4_4_ = uStack_4d8._4_4_ + 1.0;
      local_410._0_4_ = local_590._0_4_;
      local_410._4_4_ = local_590._4_4_;
      uStack_408._0_4_ = local_590._8_4_;
      uStack_408._4_4_ = local_590._12_4_;
      local_5a0._4_4_ = (int)local_410._4_4_;
      local_5a0._0_4_ = (int)(float)local_410;
      local_5a0._8_4_ = (int)(float)uStack_408;
      local_5a0._12_4_ = (int)uStack_408._4_4_;
      local_210 = local_5a0._0_8_;
      uStack_208 = local_5a0._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar58._8_8_ = local_5a0._8_8_;
      auVar58._0_8_ = local_5a0._0_8_;
      auVar57._8_8_ = 0x7f0000007f;
      auVar57._0_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx(auVar58,auVar57);
      local_5a0._0_8_ = auVar16._0_8_;
      local_1f0 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar16._8_8_;
      uStack_1e8 = local_5a0._8_8_;
      local_1f4 = 0x17;
      local_5a0 = vpslld_avx(auVar16,ZEXT416(0x17));
      local_1e0 = local_5a0._0_8_;
      uStack_1d8 = local_5a0._8_8_;
      local_5e0 = local_5a0._0_8_;
      uStack_5d8 = local_5a0._8_8_;
      local_480 = local_5d0;
      uStack_478 = uStack_5c8;
      local_490._0_4_ = local_5a0._0_4_;
      local_490._4_4_ = local_5a0._4_4_;
      uStack_488._0_4_ = local_5a0._8_4_;
      uStack_488._4_4_ = local_5a0._12_4_;
      local_5d0 = CONCAT44((local_4e0._4_4_ + 1.0) * local_490._4_4_,
                           ((float)local_4e0 + 1.0) * (float)local_490);
      uStack_5c8._0_4_ = ((float)uStack_4d8 + 1.0) * (float)uStack_488;
      uStack_5c8._4_4_ = (uStack_4d8._4_4_ + 1.0) * uStack_488._4_4_;
      local_5f0 = local_5d0;
      uStack_5e8 = uStack_5c8;
      local_2594 = 0x3f800000;
      local_25b0 = 0x3f800000;
      local_600 = 0x3f8000003f800000;
      uStack_5f8 = 0x3f8000003f800000;
      auVar17._8_8_ = uStack_5c8;
      auVar17._0_8_ = local_5d0;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      local_25f0 = vsubps_avx(auVar17,auVar16);
      local_430._0_4_ = local_25f0._0_4_;
      local_430._4_4_ = local_25f0._4_4_;
      uStack_428._0_4_ = local_25f0._8_4_;
      uStack_428._4_4_ = local_25f0._12_4_;
      local_4b0 = local_2630 * (float)local_430;
      fStack_4ac = local_2630 * local_430._4_4_;
      fStack_4a8 = local_2630 * (float)uStack_428;
      fStack_4a4 = local_2630 * uStack_428._4_4_;
      local_4a0._0_4_ = local_25e0._0_4_;
      local_4a0._4_4_ = local_25e0._4_4_;
      fStack_498 = local_25e0._8_4_;
      fStack_494 = local_25e0._12_4_;
      local_2610 = (float)local_4a0._0_4_ + local_4b0;
      fStack_260c = (float)local_4a0._4_4_ + fStack_4ac;
      fStack_2608 = fStack_498 + fStack_4a8;
      fStack_2604 = fStack_494 + fStack_4a4;
      *(ulong *)*local_29f0 = CONCAT44(fStack_260c,local_2610);
      *(ulong *)(*local_29f0 + 8) = CONCAT44(fStack_2604,fStack_2608);
      local_29f0 = (undefined1 (*) [64])(*local_29f0 + 0x10);
      local_25d0 = CONCAT44(local_2630,local_2630);
      uStack_25c8 = CONCAT44(local_2630,local_2630);
      uStack_25ac = local_25b0;
      uStack_25a8 = local_25b0;
      uStack_25a4 = local_25b0;
      local_660 = local_25c0;
      uStack_658 = uStack_25b8;
      local_620 = local_25c0;
      uStack_618 = uStack_25b8;
      local_4e0 = uVar26;
      uStack_4d8 = uVar27;
      _local_4a0 = local_25e0;
      local_490 = local_5a0._0_8_;
      uStack_488 = local_5a0._8_8_;
      local_460 = local_470;
      uStack_458 = uStack_468;
      local_440 = uVar22;
      uStack_438 = uVar25;
      local_430 = local_25f0._0_8_;
      uStack_428 = local_25f0._8_8_;
      local_420 = CONCAT44(local_2630,local_2630);
      uStack_418 = CONCAT44(local_2630,local_2630);
      local_410 = local_590;
      uStack_408 = uStack_588;
    }
    for (; local_2a48 < local_29e4; local_2a48 = local_2a48 + 1) {
      if (*(float *)*local_29f0 < 0.0) {
        fVar80 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        dVar77 = std::exp((double)(ulong)*(uint *)*local_29f0);
        *(float *)*local_29f0 = fVar80 * (SUB84(dVar77,0) - 1.0);
      }
      local_29f0 = (undefined1 (*) [64])(*local_29f0 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = static_cast<float>(alpha * (exp(*ptr) - 1.f));
            ptr++;
        }
    }

    return 0;
}